

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  ptls_key_exchange_context_t **pppVar1;
  ptls_esni_secret_t **esni;
  ptls_key_exchange_algorithm_t *ppVar2;
  uint8_t *puVar3;
  ushort uVar4;
  uint16_t uVar5;
  ptls_context_t *ppVar6;
  char *pcVar7;
  anon_struct_72_2_510fbff9 *paVar8;
  st_ptls_on_client_hello_t *psVar9;
  st_ptls_on_extension_t *psVar10;
  ptls_cipher_suite_t *ppVar11;
  st_ptls_update_esni_key_t *psVar12;
  st_ptls_update_traffic_key_t *psVar13;
  st_ptls_hash_context_t *psVar14;
  size_t delta;
  ptls_buffer_t *ppVar15;
  ptls_buffer_t *ppVar16;
  undefined8 uVar17;
  ptls_aead_algorithm_t *ppVar18;
  intptr_t iVar19;
  ptls_iovec_t pVar20;
  ptls_iovec_t ikm;
  ptls_iovec_t tbs;
  ptls_aead_algorithm_t **pppVar21;
  ptls_aead_context_t *ppVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  en_ptls_state_t eVar27;
  uint uVar28;
  size_t sVar29;
  ptls_esni_secret_t *ppVar30;
  ulong uVar31;
  ptls_key_exchange_algorithm_t *ppVar32;
  ptls_key_exchange_algorithm_t *ppVar33;
  ptls_key_schedule_t *ppVar34;
  uint8_t *puVar35;
  ptls_key_exchange_algorithm_t *ppVar36;
  long lVar37;
  ulong uVar38;
  long lVar39;
  ptls_key_exchange_algorithm_t *ppVar40;
  uint8_t *puVar41;
  undefined1 *puVar42;
  ptls_key_exchange_algorithm_t *ppVar43;
  size_t sVar44;
  size_t sVar45;
  ushort uVar46;
  size_t *psVar47;
  anon_struct_72_2_510fbff9 *paVar48;
  long lVar49;
  ulong uVar50;
  ptls_key_exchange_algorithm_t *ppVar51;
  long lVar52;
  ulong uVar53;
  uint16_t *puVar54;
  ulong uVar55;
  uint32_t uVar56;
  ulong uVar57;
  ptls_hash_context_t **pppVar58;
  size_t sVar59;
  ptls_esni_context_t *ppVar60;
  ulong uVar61;
  ptls_key_exchange_context_t **pppVar62;
  size_t sVar63;
  byte bVar64;
  ptls_esni_context_t **pppVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  ptls_iovec_t tbs_00;
  ptls_iovec_t pVar70;
  ptls_iovec_t ch_trunc;
  ptls_aead_context_t *aead;
  uint8_t iv [16];
  int accept_early_data;
  size_t psk_index;
  anon_struct_24_2_cc7b932a key_share;
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t pubkey;
  st_ptls_client_hello_t ch;
  ptls_key_exchange_algorithm_t *local_688;
  size_t local_680;
  size_t local_668;
  size_t local_660;
  size_t local_628;
  ushort local_61a;
  ptls_aead_context_t *local_618;
  uint8_t auStack_610 [6];
  uint16_t local_60a;
  ptls_on_client_hello_parameters_t local_608;
  ptls_cipher_suite_t **local_598;
  int local_58c;
  ulong local_588;
  ptls_key_exchange_algorithm_t *local_580;
  size_t local_578;
  size_t local_570;
  ptls_key_exchange_algorithm_t *local_568;
  ptls_iovec_t pStack_560;
  ptls_iovec_t local_548;
  ulong local_530;
  ptls_iovec_t local_528;
  st_ptls_client_hello_t local_518;
  
  sVar59 = message.len;
  puVar35 = message.base;
  bVar67 = false;
  memset(&local_518,0,0x4e8);
  local_518.unknown_extensions[0].type = 0xffff;
  local_568 = (ptls_key_exchange_algorithm_t *)0x0;
  pStack_560.base = (uint8_t *)0x0;
  pStack_560.len = 0;
  local_570 = 0xffffffffffffffff;
  local_528.base = (uint8_t *)0x0;
  local_528.len = 0;
  local_548.base = (uint8_t *)0x0;
  local_548.len = 0;
  local_58c = 0;
  eVar27 = tls->state;
  bVar66 = eVar27 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
  local_608.server_name.base = puVar35 + 4;
  if ((long)sVar59 < 6) {
    uVar28 = 0x32;
  }
  else {
    local_608.server_name.base = puVar35 + 6;
    bVar67 = (ushort)(*(ushort *)(puVar35 + 4) << 8 | *(ushort *)(puVar35 + 4) >> 8) == 0x303;
    uVar28 = 0x28;
    if (bVar67) {
      uVar28 = 0;
    }
  }
  ppVar2 = (ptls_key_exchange_algorithm_t *)(puVar35 + sVar59);
  uVar25 = uVar28;
  if ((bVar67) && (uVar25 = 0x32, 0x1f < (long)ppVar2 - (long)local_608.server_name.base)) {
    local_518.random_bytes = local_608.server_name.base;
    ppVar36 = (ptls_key_exchange_algorithm_t *)((long)local_608.server_name.base + 0x20);
    uVar25 = 0x32;
    if ((ptls_key_exchange_algorithm_t *)((long)local_608.server_name.base + 0x20) == ppVar2) {
LAB_00117452:
      local_608.server_name.base = (uint8_t *)ppVar36;
      bVar67 = false;
    }
    else {
      ppVar36 = (ptls_key_exchange_algorithm_t *)
                ((long)&((ptls_key_exchange_algorithm_t *)((long)local_608.server_name.base + 0x20))
                        ->id + 1);
      uVar38 = (ulong)*(byte *)&((ptls_key_exchange_algorithm_t *)
                                ((long)local_608.server_name.base + 0x20))->id;
      if ((ulong)((long)ppVar2 - (long)ppVar36) < uVar38) goto LAB_00117452;
      bVar67 = *(byte *)&((ptls_key_exchange_algorithm_t *)((long)local_608.server_name.base + 0x20)
                         )->id < 0x21;
      local_608.server_name.base = (uint8_t *)ppVar36;
      if (bVar67) {
        local_518.legacy_session_id.base = (uint8_t *)ppVar36;
        local_608.server_name.base = (uint8_t *)((long)&ppVar36->id + uVar38);
        local_518.legacy_session_id.len = uVar38;
        bVar67 = true;
        uVar25 = uVar28;
      }
    }
    if (bVar67) {
      uVar28 = 0x32;
      if ((ulong)((long)ppVar2 - (long)local_608.server_name.base) < 2) {
LAB_001174a7:
        bVar67 = false;
      }
      else {
        lVar37 = 0;
        uVar38 = 0;
        do {
          uVar38 = (ulong)*(byte *)((long)(ptls_aead_algorithm_t **)local_608.server_name.base +
                                   lVar37) | uVar38 << 8;
          lVar37 = lVar37 + 1;
        } while (lVar37 != 2);
        ppVar36 = (ptls_key_exchange_algorithm_t *)((long)local_608.server_name.base + 2);
        local_608.server_name.base = (uint8_t *)ppVar36;
        if ((ulong)((long)ppVar2 - (long)ppVar36) < uVar38) goto LAB_001174a7;
        ppVar43 = (ptls_key_exchange_algorithm_t *)((long)ppVar36 + uVar38);
        local_518.cipher_suites.base = (uint8_t *)ppVar36;
        local_518.cipher_suites.len = uVar38;
        uVar38 = 0x200;
        while( true ) {
          lVar37 = (long)ppVar43 - (long)ppVar36;
          uVar25 = 0x32;
          local_608.server_name.base = (uint8_t *)ppVar36;
          if (lVar37 < 2) break;
          *(uint16_t *)((long)local_518.signature_algorithms.list + (uVar38 - 0x60)) =
               ppVar36->id << 8 | ppVar36->id >> 8;
          ppVar36 = (ptls_key_exchange_algorithm_t *)&ppVar36->field_0x2;
          uVar25 = 0;
          local_518.client_ciphers.count = local_518.client_ciphers.count + 1;
          local_608.server_name.base = (uint8_t *)ppVar43;
          if ((0x23d < uVar38) ||
             (uVar38 = uVar38 + 2, local_608.server_name.base = (uint8_t *)ppVar36,
             ppVar36 == ppVar43)) break;
        }
        uVar28 = 0x32;
        if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar43) {
          uVar28 = uVar25;
        }
        if (lVar37 < 2) {
          uVar28 = uVar25;
        }
        bVar67 = 1 < lVar37 &&
                 (ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar43;
      }
      uVar25 = uVar28;
      if (bVar67) {
        uVar25 = 0x32;
        if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar2) {
LAB_001175ba:
          bVar67 = false;
        }
        else {
          ppVar36 = (ptls_key_exchange_algorithm_t *)
                    ((long)(ptls_aead_algorithm_t **)local_608.server_name.base + 1);
          uVar38 = (ulong)*(byte *)(ptls_aead_algorithm_t **)local_608.server_name.base;
          local_608.server_name.base = (uint8_t *)ppVar36;
          if ((ulong)((long)ppVar2 - (long)ppVar36) < uVar38) goto LAB_001175ba;
          bVar67 = uVar38 != 0;
          if (bVar67) {
            local_518.compression_methods.ids = (uint8_t *)ppVar36;
            local_608.server_name.base = (uint8_t *)((long)&ppVar36->id + uVar38);
            local_518.compression_methods.count = uVar38;
            bVar67 = true;
            uVar25 = uVar28;
          }
        }
        if (bVar67) {
          local_618 = (st_ptls_aead_context_t *)0x0;
          puVar41 = local_608.server_name.base;
          if ((ulong)((long)ppVar2 - (long)local_608.server_name.base) < 2) {
LAB_00117648:
            local_608.server_name.base = puVar41;
            bVar67 = false;
            bVar68 = false;
            uVar25 = 0x32;
          }
          else {
            lVar37 = 0;
            uVar38 = 0;
            do {
              uVar38 = (ulong)*(byte *)((long)(ptls_aead_algorithm_t **)local_608.server_name.base +
                                       lVar37) | uVar38 << 8;
              lVar37 = lVar37 + 1;
            } while (lVar37 != 2);
            puVar41 = (uint8_t *)((long)local_608.server_name.base + 2);
            if ((ulong)((long)ppVar2 - (long)puVar41) < uVar38) goto LAB_00117648;
            bVar68 = uVar38 == 0;
            if (bVar68) {
              bVar67 = false;
              local_608.server_name.base = puVar41;
            }
            else {
              ppVar36 = (ptls_key_exchange_algorithm_t *)
                        ((undefined1 *)((long)local_608.server_name.base + 2) + uVar38);
              bVar68 = false;
              uVar46 = 0;
              local_608.server_name.base = puVar41;
              while (uVar25 = 0x32, 1 < (long)ppVar36 - (long)local_608.server_name.base) {
                uVar4 = *(ushort *)(ptls_aead_algorithm_t **)local_608.server_name.base;
                uVar46 = uVar4 << 8 | uVar4 >> 8;
                local_608.server_name.base = (undefined1 *)((long)local_608.server_name.base + 2);
                if (uVar46 < 0x40) {
                  if ((auStack_610[(ulong)(uVar46 >> 3) - 8] >> (uVar46 & 7) & 1) != 0) {
                    uVar25 = 0x2f;
                    break;
                  }
                  auStack_610[(ulong)(uVar46 >> 3) - 8] =
                       auStack_610[(ulong)(uVar46 >> 3) - 8] | (byte)(1 << ((byte)(uVar4 >> 8) & 7))
                  ;
                }
                uVar28 = 0x32;
                uVar25 = 0x32;
                if ((ulong)((long)ppVar36 - (long)local_608.server_name.base) < 2)
                goto LAB_00117b80;
                lVar37 = 0;
                uVar38 = 0;
                do {
                  uVar38 = (ulong)*(byte *)((long)(ptls_aead_algorithm_t **)
                                                  local_608.server_name.base + lVar37) | uVar38 << 8
                  ;
                  lVar37 = lVar37 + 1;
                } while (lVar37 != 2);
                puVar42 = (undefined1 *)((long)local_608.server_name.base + 2);
                uVar26 = 0;
                local_608.server_name.base = puVar42;
                if ((ulong)((long)ppVar36 - (long)puVar42) < uVar38) {
LAB_00117bbd:
                  bVar67 = false;
                  uVar25 = uVar28;
                  goto LAB_00118b6e;
                }
                psVar10 = tls->ctx->on_extension;
                if (psVar10 != (st_ptls_on_extension_t *)0x0) {
                  pVar70.len = uVar38;
                  pVar70.base = puVar42;
                  iVar23 = (*psVar10->cb)(psVar10,tls,'\x01',uVar46,pVar70);
                  bVar67 = iVar23 != 0;
                  uVar26 = (uint)bVar67;
                  uVar28 = (uint)bVar67;
                  if (iVar23 == 0) goto LAB_00117c63;
                  goto LAB_00117c34;
                }
LAB_00117c63:
                puVar41 = local_608.server_name.base;
                ppVar43 = (ptls_key_exchange_algorithm_t *)(puVar42 + uVar38);
                uVar28 = uVar26;
                if (uVar46 < 0x1b) {
                  if (uVar46 < 10) {
                    if (uVar46 != 0) {
                      if (uVar46 != 5) goto switchD_00117c8e_caseD_2e;
                      local_518._1248_1_ = local_518._1248_1_ | 1;
                      goto LAB_00118b62;
                    }
                    uVar26 = client_hello_decode_server_name
                                       (&local_518.server_name,(uint8_t **)&local_608,
                                        (uint8_t *)ppVar43);
                    if (uVar26 == 0) {
                      uVar28 = 0;
                      if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar43)
                      goto LAB_00118b62;
                      bVar67 = false;
                    }
                    else {
LAB_00117e76:
                      bVar67 = false;
                      uVar25 = uVar26;
                    }
                    goto LAB_00118b6e;
                  }
                  if (uVar46 == 10) {
                    local_518.negotiated_groups.base = local_608.server_name.base;
                    local_518.negotiated_groups.len =
                         (long)ppVar43 - (long)local_608.server_name.base;
                    goto LAB_00118b62;
                  }
                  if (uVar46 == 0xd) {
                    uVar26 = decode_signature_algorithms
                                       (&local_518.signature_algorithms,(uint8_t **)&local_608,
                                        (uint8_t *)ppVar43);
                    uVar28 = 0;
                    if (uVar26 != 0) goto LAB_00117e76;
                    goto LAB_00118b62;
                  }
                  if (uVar46 != 0x10) goto switchD_00117c8e_caseD_2e;
                  uVar28 = 0x32;
                  if ((ulong)((long)ppVar43 - (long)local_608.server_name.base) < 2) {
LAB_00117d6a:
                    bVar67 = false;
                  }
                  else {
                    lVar37 = 0;
                    uVar38 = 0;
                    do {
                      uVar38 = (ulong)*(byte *)((long)(ptls_aead_algorithm_t **)
                                                      local_608.server_name.base + lVar37) |
                               uVar38 << 8;
                      lVar37 = lVar37 + 1;
                    } while (lVar37 != 2);
                    local_608.server_name.base = (uint8_t *)((long)local_608.server_name.base + 2);
                    if ((ulong)((long)ppVar43 - (long)local_608.server_name.base) < uVar38)
                    goto LAB_00117d6a;
                    ppVar33 = (ptls_key_exchange_algorithm_t *)(local_608.server_name.base + uVar38)
                    ;
                    sVar45 = local_518.alpn.count;
                    uVar28 = uVar26;
                    do {
                      ppVar32 = (ptls_key_exchange_algorithm_t *)local_608.server_name.base;
                      uVar38 = sVar45;
                      if (ppVar33 == (ptls_key_exchange_algorithm_t *)local_608.server_name.base) {
LAB_00118324:
                        bVar67 = false;
                        local_608.server_name.base = (uint8_t *)ppVar32;
LAB_00118326:
                        uVar28 = 0x32;
                      }
                      else {
                        uVar31 = (ulong)*(byte *)&((ptls_key_exchange_algorithm_t *)
                                                  local_608.server_name.base)->id;
                        ppVar32 = (ptls_key_exchange_algorithm_t *)
                                  ((long)&((ptls_key_exchange_algorithm_t *)
                                          local_608.server_name.base)->id + 1);
                        if ((ulong)((long)ppVar33 - (long)ppVar32) < uVar31) goto LAB_00118324;
                        bVar67 = uVar31 != 0;
                        local_608.server_name.base = (uint8_t *)ppVar32;
                        if (uVar31 == 0) goto LAB_00118326;
                        local_608.server_name.base = (uint8_t *)((long)&ppVar32->id + uVar31);
                        bVar67 = true;
                        if (sVar45 < 0x10) {
                          uVar38 = sVar45 + 1;
                          local_518.alpn.count = uVar38;
                          local_518.alpn.list[sVar45].base = (uint8_t *)ppVar32;
                          local_518.alpn.list[sVar45].len = uVar31;
                        }
                      }
                    } while ((bVar67) &&
                            (sVar45 = uVar38,
                            (ptls_key_exchange_algorithm_t *)local_608.server_name.base != ppVar33))
                    ;
                  }
                  if (!bVar67) goto LAB_00117c34;
                  goto joined_r0x001183b1;
                }
                switch(uVar46) {
                case 0x29:
                  uVar28 = 0x32;
                  if ((ulong)((long)ppVar43 - (long)local_608.server_name.base) < 2) {
                    local_588 = 0;
                    bVar67 = false;
                  }
                  else {
                    lVar37 = 0;
                    uVar38 = 0;
                    do {
                      uVar50 = uVar38;
                      lVar49 = uVar50 * 0x100;
                      uVar31 = (ulong)*(byte *)((long)(ptls_aead_algorithm_t **)
                                                      local_608.server_name.base + lVar37);
                      uVar38 = lVar49 + uVar31;
                      lVar37 = lVar37 + 1;
                    } while (lVar37 != 2);
                    ppVar33 = (ptls_key_exchange_algorithm_t *)
                              ((long)local_608.server_name.base + 2);
                    local_608.server_name.base = (uint8_t *)ppVar33;
                    if ((ulong)((long)ppVar43 - (long)ppVar33) < uVar38) {
                      local_588 = 0;
                      bVar67 = false;
                    }
                    else {
                      ppVar32 = (ptls_key_exchange_algorithm_t *)
                                ((long)ppVar33 + uVar31 + uVar50 * 0x100);
                      local_530 = local_518.psk.identities.count;
                      local_588 = 0;
                      do {
                        bVar67 = true;
                        if ((ulong)((long)ppVar32 - (long)ppVar33) < 2) {
                          ppVar51 = (ptls_key_exchange_algorithm_t *)0x0;
                          uVar38 = 0;
                          bVar69 = false;
                          uVar26 = 0x32;
                        }
                        else {
                          lVar37 = 2;
                          uVar38 = 0;
                          ppVar40 = ppVar33;
                          do {
                            uVar50 = uVar38 * 0x100;
                            ppVar51 = (ptls_key_exchange_algorithm_t *)((long)&ppVar40->id + 1);
                            pppVar21 = (ptls_aead_algorithm_t **)&ppVar40->id;
                            uVar38 = uVar50 + *(byte *)pppVar21;
                            lVar37 = lVar37 + -1;
                            ppVar40 = ppVar51;
                          } while (lVar37 != 0);
                          bVar69 = uVar38 <= (long)puVar41 + ((uVar31 + lVar49) - (long)ppVar33);
                          if (bVar69) {
                            ppVar33 = (ptls_key_exchange_algorithm_t *)
                                      ((long)&ppVar51->id + (uVar50 | *(byte *)pppVar21));
                          }
                          else {
                            uVar38 = 0;
                            ppVar33 = ppVar51;
                            ppVar51 = (ptls_key_exchange_algorithm_t *)0x0;
                            uVar26 = 0x32;
                          }
                          bVar67 = !bVar69;
                          local_608.server_name.base = (uint8_t *)ppVar33;
                        }
                        if (bVar69) {
                          lVar37 = (long)ppVar32 - (long)ppVar33;
                          if (lVar37 < 4) {
                            uVar26 = 0x32;
                            uVar56 = 0;
                          }
                          else {
                            uVar28 = *(uint *)ppVar33;
                            uVar56 = uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 |
                                     (uVar28 & 0xff00) << 8 | uVar28 << 0x18;
                            ppVar33 = (ptls_key_exchange_algorithm_t *)&ppVar33->field_0x4;
                            uVar26 = 0;
                            local_608.server_name.base = (uint8_t *)ppVar33;
                          }
                          bVar67 = true;
                          if (3 < lVar37) {
                            if (local_530 < 4) {
                              local_518.psk.identities.count = local_530 + 1;
                              local_518.psk.identities.list[local_530].identity.base =
                                   (uint8_t *)ppVar51;
                              local_518.psk.identities.list[local_530].identity.len = uVar38;
                              local_518.psk.identities.list[local_530].obfuscated_ticket_age =
                                   uVar56;
                              *(undefined8 *)&local_518.psk.identities.list[local_530].field_0x14 =
                                   0;
                              *(undefined8 *)
                               ((long)&local_518.psk.identities.list[local_530].binder.base + 4) = 0
                              ;
                              *(undefined4 *)
                               ((long)&local_518.psk.identities.list[local_530].binder.len + 4) = 0;
                              local_530 = local_530 + 1;
                            }
                            local_588 = local_588 + 1;
                            bVar67 = false;
                            uVar26 = 0;
                          }
                        }
                        bVar67 = !bVar67;
                        uVar28 = uVar26;
                      } while ((bVar67) && (ppVar33 != ppVar32));
                    }
                  }
                  sVar45 = local_518.psk.identities.count;
                  if (bVar67) {
                    local_518.psk.hash_end = local_608.server_name.base;
                    if ((ulong)((long)ppVar43 - (long)local_608.server_name.base) < 2) {
                      bVar67 = false;
                      uVar28 = 0x32;
                    }
                    else {
                      lVar37 = 0;
                      uVar38 = 0;
                      do {
                        uVar38 = (ulong)*(byte *)((long)(ptls_aead_algorithm_t **)
                                                        local_608.server_name.base + lVar37) |
                                 uVar38 << 8;
                        lVar37 = lVar37 + 1;
                      } while (lVar37 != 2);
                      local_608.server_name.base = (uint8_t *)((long)local_608.server_name.base + 2)
                      ;
                      if ((ulong)((long)ppVar43 - (long)local_608.server_name.base) < uVar38) {
                        bVar67 = false;
                        uVar28 = 0x32;
                      }
                      else {
                        ppVar32 = (ptls_key_exchange_algorithm_t *)
                                  (local_608.server_name.base + uVar38);
                        psVar47 = &local_518.psk.identities.list[0].binder.len;
                        uVar38 = 0;
                        ppVar33 = (ptls_key_exchange_algorithm_t *)local_608.server_name.base;
                        uVar25 = uVar28;
                        do {
                          ppVar40 = ppVar33;
                          if (ppVar32 == ppVar33) {
LAB_00118761:
                            bVar67 = false;
                            uVar25 = 0x32;
                          }
                          else {
                            ppVar40 = (ptls_key_exchange_algorithm_t *)((long)&ppVar33->id + 1);
                            uVar31 = (ulong)*(byte *)&ppVar33->id;
                            local_608.server_name.base = (uint8_t *)ppVar40;
                            if ((ulong)((long)ppVar32 - (long)ppVar40) < uVar31) goto LAB_00118761;
                            if (uVar38 < sVar45) {
                              ((ptls_iovec_t *)(psVar47 + -1))->base = (uint8_t *)ppVar40;
                              *psVar47 = uVar31;
                            }
                            ppVar40 = (ptls_key_exchange_algorithm_t *)((long)&ppVar40->id + uVar31)
                            ;
                            bVar67 = true;
                            local_608.server_name.base = (uint8_t *)ppVar40;
                          }
                          if (!bVar67) goto LAB_001187aa;
                          uVar38 = uVar38 + 1;
                          psVar47 = psVar47 + 5;
                          ppVar33 = ppVar40;
                        } while (ppVar40 != ppVar32);
                        bVar67 = local_588 == uVar38;
                        if (!bVar67) {
                          uVar25 = 0x2f;
                        }
LAB_001187aa:
                        uVar28 = 0x32;
                        if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar32)
                        {
                          uVar28 = uVar25;
                        }
                        if (!bVar67) {
                          uVar28 = uVar25;
                        }
                        bVar67 = (bool)((ptls_key_exchange_algorithm_t *)local_608.server_name.base
                                        == ppVar32 & bVar67);
                      }
                    }
                    if (bVar67) {
                      bVar67 = (ptls_key_exchange_algorithm_t *)local_608.server_name.base ==
                               ppVar43;
                      if (!bVar67) {
                        uVar28 = 0x32;
                      }
                    }
                    else {
                      bVar67 = false;
                    }
                  }
                  else {
                    bVar67 = false;
                  }
                  if (bVar67) break;
                  goto LAB_00117b80;
                case 0x2a:
                  local_518.psk.early_data_indication = 1;
                  break;
                case 0x2b:
                  if (ppVar43 != (ptls_key_exchange_algorithm_t *)local_608.server_name.base) {
                    ppVar33 = (ptls_key_exchange_algorithm_t *)
                              ((long)(ptls_aead_algorithm_t **)local_608.server_name.base + 1);
                    pppVar21 = (ptls_aead_algorithm_t **)local_608.server_name.base;
                    local_608.server_name.base = (uint8_t *)ppVar33;
                    if ((ulong)*(byte *)pppVar21 <= (ulong)((long)ppVar43 - (long)ppVar33)) {
                      ppVar32 = (ptls_key_exchange_algorithm_t *)
                                ((long)&ppVar33->id + (ulong)*(byte *)pppVar21);
                      lVar37 = 4;
                      do {
                        lVar49 = (long)ppVar32 - (long)ppVar33;
                        uVar25 = 0x32;
                        bVar67 = 1 < lVar49;
                        if (1 < lVar49) {
                          local_578 = CONCAT62(local_578._2_6_,ppVar33->id << 8 | ppVar33->id >> 8);
                          ppVar33 = (ptls_key_exchange_algorithm_t *)&ppVar33->field_0x2;
                          uVar25 = 0;
                          local_608.server_name.base = (uint8_t *)ppVar33;
                        }
                        lVar39 = lVar37;
                        if (lVar37 != 0 && 1 < lVar49) {
                          puVar54 = supported_versions;
                          lVar52 = 0;
                          do {
                            lVar39 = lVar52;
                            if (*puVar54 == (uint16_t)local_578) break;
                            lVar52 = lVar52 + 1;
                            puVar54 = puVar54 + 1;
                            lVar39 = lVar37;
                          } while (lVar37 != lVar52);
                        }
                        if (lVar49 < 2) goto LAB_0011803b;
                        lVar37 = lVar39;
                      } while (ppVar33 != ppVar32);
                      bVar67 = true;
                      if (lVar39 != 4) {
                        local_518.selected_version = supported_versions[lVar39];
                      }
LAB_0011803b:
                      uVar28 = 0x32;
                      if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar32) {
                        uVar28 = uVar25;
                      }
                      if (!bVar67) {
                        uVar28 = uVar25;
                      }
                      bVar67 = (bool)((ptls_key_exchange_algorithm_t *)local_608.server_name.base ==
                                      ppVar32 & bVar67);
                      goto joined_r0x00118408;
                    }
                  }
LAB_0011816c:
                  uVar28 = 0x32;
                  bVar67 = false;
                  goto joined_r0x00118408;
                case 0x2c:
                  uVar28 = 0x2f;
                  if (properties == (ptls_handshake_properties_t *)0x0) goto LAB_00117bbd;
                  if ((properties->field_0).server.cookie.key == (void *)0x0) goto LAB_00117b80;
                  local_518.cookie.all.base = local_608.server_name.base;
                  local_518.cookie.all.len = (long)ppVar43 - (long)local_608.server_name.base;
                  uVar28 = 0x32;
                  puVar3 = local_608.server_name.base;
                  if ((ulong)((long)ppVar43 - (long)local_608.server_name.base) < 2) {
LAB_00118124:
                    local_608.server_name.base = puVar3;
                    bVar67 = false;
                  }
                  else {
                    lVar37 = 0;
                    uVar38 = 0;
                    do {
                      uVar31 = uVar38;
                      uVar50 = uVar31 * 0x100;
                      uVar55 = (ulong)*(byte *)((long)(ptls_aead_algorithm_t **)
                                                      local_608.server_name.base + lVar37);
                      uVar38 = uVar50 + uVar55;
                      lVar37 = lVar37 + 1;
                    } while (lVar37 != 2);
                    puVar3 = (uint8_t *)((long)local_608.server_name.base + 2);
                    if ((ulong)((long)ppVar43 - (long)puVar3) < uVar38) goto LAB_00118124;
                    local_518.cookie.tbs.base = puVar3;
                    bVar67 = true;
                    ppVar33 = (ptls_key_exchange_algorithm_t *)puVar3;
                    uVar28 = 0x32;
                    if (1 < uVar38) {
                      lVar37 = 0;
                      uVar38 = 0;
                      do {
                        uVar53 = uVar38;
                        uVar57 = uVar53 * 0x100;
                        uVar61 = (ulong)(byte)((undefined1 *)((long)local_608.server_name.base + 2))
                                              [lVar37];
                        uVar38 = uVar57 + uVar61;
                        lVar37 = lVar37 + 1;
                      } while (lVar37 != 2);
                      ppVar33 = (ptls_key_exchange_algorithm_t *)
                                ((long)local_608.server_name.base + 4);
                      if (uVar38 <= (uVar50 | uVar55) - 2) {
                        uVar25 = 0x32;
                        bVar67 = true;
                        if (uVar38 == 0) {
                          bVar69 = false;
                        }
                        else {
                          ppVar33 = (ptls_key_exchange_algorithm_t *)
                                    ((long)local_608.server_name.base + 5);
                          uVar38 = (ulong)(byte)*(undefined1 *)
                                                 ((long)local_608.server_name.base + 4);
                          bVar69 = false;
                          if (uVar38 <= (long)local_608.server_name.base +
                                        ((uVar57 | uVar61) - (long)ppVar33) + 4) {
                            local_518.cookie.ch1_hash.base = (uint8_t *)ppVar33;
                            local_518.cookie.ch1_hash.len = uVar38;
                            bVar69 = true;
                            bVar67 = false;
                            uVar25 = uVar26;
                            ppVar33 = (ptls_key_exchange_algorithm_t *)
                                      ((undefined1 *)((long)local_608.server_name.base + 5) + uVar38
                                      );
                          }
                        }
                        local_608.server_name.base = (uint8_t *)ppVar33;
                        ppVar33 = (ptls_key_exchange_algorithm_t *)local_608.server_name.base;
                        uVar28 = uVar25;
                        if (bVar69) {
                          ppVar32 = (ptls_key_exchange_algorithm_t *)
                                    (&((ptls_key_exchange_algorithm_t *)
                                      ((long)puVar41 + uVar53 * 8 * 0x20))->field_0x4 + uVar61);
                          bVar67 = true;
                          uVar28 = 0x32;
                          if (ppVar32 != (ptls_key_exchange_algorithm_t *)local_608.server_name.base
                             ) {
                            ppVar33 = (ptls_key_exchange_algorithm_t *)
                                      ((long)(ptls_aead_algorithm_t **)local_608.server_name.base +
                                      1);
                            if (*(char *)(ptls_aead_algorithm_t **)local_608.server_name.base ==
                                '\x01') {
                              local_518.cookie._64_1_ = local_518.cookie._64_1_ | 1;
                            }
                            else {
                              if (*(char *)(ptls_aead_algorithm_t **)local_608.server_name.base !=
                                  '\0') goto LAB_00118bdc;
                              if ((local_518.cookie._64_1_ & 1) != 0) {
                                local_608.server_name.base = (uint8_t *)ppVar33;
                                __assert_fail("!ch->cookie.sent_key_share",
                                              "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                                              ,0xd05,
                                              "int decode_client_hello(ptls_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *)"
                                             );
                              }
                            }
                            bVar67 = ppVar32 != ppVar33;
                            uVar28 = uVar25;
                            if (bVar67) {
                              uVar28 = 0x32;
                            }
                          }
                        }
                      }
                    }
LAB_00118bdc:
                    local_608.server_name.base = (uint8_t *)ppVar33;
                    if (!bVar67) {
                      ppVar33 = (ptls_key_exchange_algorithm_t *)(puVar3 + uVar55 + uVar31 * 0x100);
                      local_518.cookie.tbs.len = (long)local_608.server_name.base - (long)puVar3;
                      bVar67 = true;
                      uVar25 = 0x32;
                      if (ppVar33 == (ptls_key_exchange_algorithm_t *)local_608.server_name.base) {
                        bVar69 = false;
                      }
                      else {
                        ppVar32 = (ptls_key_exchange_algorithm_t *)
                                  ((long)(ptls_aead_algorithm_t **)local_608.server_name.base + 1);
                        uVar38 = (ulong)*(byte *)(ptls_aead_algorithm_t **)
                                                 local_608.server_name.base;
                        bVar69 = false;
                        local_608.server_name.base = (uint8_t *)ppVar32;
                        if (uVar38 <= (ulong)((long)ppVar33 - (long)ppVar32)) {
                          local_518.cookie.signature.base = (uint8_t *)ppVar32;
                          local_608.server_name.base = (uint8_t *)((long)&ppVar32->id + uVar38);
                          local_518.cookie.signature.len = uVar38;
                          bVar69 = true;
                          bVar67 = false;
                          uVar25 = uVar28;
                        }
                      }
                      uVar28 = uVar25;
                      if ((bVar69) &&
                         (bVar67 = (ptls_key_exchange_algorithm_t *)local_608.server_name.base !=
                                   ppVar33, bVar67)) {
                        uVar28 = 0x32;
                      }
                    }
                    bVar67 = !bVar67;
                  }
                  if (bVar67) {
                    if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar43)
                    break;
                    uVar28 = 0x32;
                  }
LAB_00117c34:
                  bVar67 = false;
                  uVar25 = uVar28;
                  goto LAB_00118b6e;
                case 0x2d:
                  uVar28 = 0x32;
                  if (ppVar43 != (ptls_key_exchange_algorithm_t *)local_608.server_name.base) {
                    ppVar33 = (ptls_key_exchange_algorithm_t *)
                              ((long)(ptls_aead_algorithm_t **)local_608.server_name.base + 1);
                    uVar38 = (ulong)*(byte *)(ptls_aead_algorithm_t **)local_608.server_name.base;
                    local_608.server_name.base = (uint8_t *)ppVar33;
                    if (uVar38 <= (ulong)((long)ppVar43 - (long)ppVar33)) {
                      bVar67 = uVar38 != 0;
                      uVar25 = local_518.psk.ke_modes;
                      if (bVar67) {
                        do {
                          if (*(byte *)&ppVar33->id < 0x20) {
                            uVar25 = uVar25 | 1 << (*(byte *)&ppVar33->id & 0x1f);
                            local_518.psk.ke_modes = uVar25;
                          }
                          ppVar33 = (ptls_key_exchange_algorithm_t *)((long)&ppVar33->id + 1);
                          uVar38 = uVar38 - 1;
                        } while (uVar38 != 0);
                        bVar67 = true;
                        local_608.server_name.base = (uint8_t *)ppVar33;
                        uVar28 = uVar26;
                      }
                      goto joined_r0x00118408;
                    }
                  }
                  bVar67 = false;
joined_r0x00118408:
                  if (bVar67) {
joined_r0x001183b1:
                    if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar43)
                    break;
                    uVar28 = 0x32;
                  }
LAB_00117b80:
                  bVar67 = false;
                  uVar25 = uVar28;
                  goto LAB_00118b6e;
                case 0x2e:
                case 0x2f:
                case 0x30:
                case 0x31:
                case 0x32:
switchD_00117c8e_caseD_2e:
                  handle_unknown_extension
                            (tls,properties,uVar46,local_608.server_name.base,(uint8_t *)ppVar43,
                             local_518.unknown_extensions);
                  break;
                case 0x33:
                  local_518.key_shares.base = local_608.server_name.base;
                  local_518.key_shares.len = (long)ppVar43 - (long)local_608.server_name.base;
                  break;
                default:
                  if (uVar46 == 0x1b) {
                    uVar28 = 0x32;
                    if (ppVar43 != (ptls_key_exchange_algorithm_t *)local_608.server_name.base) {
                      ppVar33 = (ptls_key_exchange_algorithm_t *)
                                ((long)(ptls_aead_algorithm_t **)local_608.server_name.base + 1);
                      if ((ulong)((long)ppVar43 - (long)ppVar33) <
                          (ulong)*(byte *)(ptls_aead_algorithm_t **)local_608.server_name.base) {
                        bVar67 = false;
                        local_608.server_name.base = (uint8_t *)ppVar33;
                      }
                      else {
                        ppVar32 = (ptls_key_exchange_algorithm_t *)
                                  ((long)&ppVar33->id +
                                  (ulong)*(byte *)(ptls_aead_algorithm_t **)
                                                  local_608.server_name.base);
                        sVar45 = local_518.cert_compression_algos.count;
                        do {
                          lVar37 = (long)ppVar32 - (long)ppVar33;
                          uVar28 = 0x32;
                          if (1 < lVar37) {
                            local_60a = ppVar33->id << 8 | ppVar33->id >> 8;
                            ppVar33 = (ptls_key_exchange_algorithm_t *)&ppVar33->field_0x2;
                            uVar28 = 0;
                          }
                          uVar38 = sVar45;
                          bVar67 = true;
                          if (1 < lVar37) {
                            bVar67 = false;
                            if (sVar45 < 0x10) {
                              uVar38 = sVar45 + 1;
                              local_518.cert_compression_algos.count = uVar38;
                              local_518.cert_compression_algos.list[sVar45] = local_60a;
                              bVar67 = false;
                            }
                          }
                          if (lVar37 < 2) goto LAB_00118482;
                          sVar45 = uVar38;
                        } while (ppVar33 != ppVar32);
                        bVar67 = false;
LAB_00118482:
                        bVar67 = !bVar67;
                        local_608.server_name.base = (uint8_t *)ppVar33;
                      }
                      goto joined_r0x00118408;
                    }
                    goto LAB_0011816c;
                  }
                  if (uVar46 != 0xffce) goto switchD_00117c8e_caseD_2e;
                  if (local_518.esni.cipher == (ptls_cipher_suite_t *)0x0) {
                    lVar37 = (long)ppVar43 - (long)local_608.server_name.base;
                    uVar28 = 0x32;
                    if (1 < lVar37) {
                      local_61a = *(ushort *)(ptls_aead_algorithm_t **)local_608.server_name.base <<
                                  8 | *(ushort *)
                                       (ptls_aead_algorithm_t **)local_608.server_name.base >> 8;
                      local_608.server_name.base = (uint8_t *)((long)local_608.server_name.base + 2)
                      ;
                      uVar28 = 0;
                    }
                    bVar67 = true;
                    if (lVar37 < 2) {
                      bVar69 = false;
                    }
                    else {
                      local_598 = tls->ctx->cipher_suites;
                      uVar28 = 0x2f;
                      bVar69 = *local_598 != (ptls_cipher_suite_t *)0x0;
                      if (bVar69) {
                        if ((*local_598)->id != local_61a) {
                          do {
                            local_598 = local_598 + 1;
                            ppVar11 = *local_598;
                            bVar69 = ppVar11 != (ptls_cipher_suite_t *)0x0;
                            if (ppVar11 == (ptls_cipher_suite_t *)0x0) {
                              goto LAB_001188fc;
                            }
                          } while (ppVar11->id != local_61a);
                        }
                        bVar67 = false;
                        uVar28 = 0;
                      }
                    }
LAB_001188fc:
                    if (bVar69) {
                      uVar28 = select_key_share(&local_518.esni.key_share,&local_518.esni.peer_key,
                                                tls->ctx->key_exchanges,(uint8_t **)&local_608,
                                                (uint8_t *)ppVar43,1);
                      if (uVar28 == 0) {
                        bVar67 = true;
                        uVar28 = 0x32;
                        if (1 < (ulong)((long)ppVar43 - (long)local_608.server_name.base)) {
                          lVar37 = 0;
                          uVar38 = 0;
                          do {
                            uVar38 = (ulong)*(byte *)((long)(ptls_aead_algorithm_t **)
                                                            local_608.server_name.base + lVar37) |
                                     uVar38 << 8;
                            lVar37 = lVar37 + 1;
                          } while (lVar37 != 2);
                          local_608.server_name.base =
                               (uint8_t *)((long)local_608.server_name.base + 2);
                          if (uVar38 <= (ulong)((long)ppVar43 - (long)local_608.server_name.base)) {
                            ppVar33 = (ptls_key_exchange_algorithm_t *)
                                      (local_608.server_name.base + uVar38);
                            uVar31 = (*local_598)->hash->digest_size;
                            if (uVar38 != uVar31) {
                              uVar25 = 0x2f;
                            }
                            else {
                              local_518.esni.record_digest = local_608.server_name.base;
                              uVar25 = 0;
                              local_608.server_name.base = (uint8_t *)ppVar33;
                            }
                            uVar28 = 0x32;
                            if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base ==
                                ppVar33) {
                              uVar28 = uVar25;
                            }
                            bVar67 = (ptls_key_exchange_algorithm_t *)local_608.server_name.base !=
                                     ppVar33;
                            if (uVar38 != uVar31) {
                              bVar67 = uVar38 != uVar31;
                              uVar28 = uVar25;
                            }
                          }
                        }
                        if (!bVar67) {
                          bVar67 = true;
                          uVar25 = 0x32;
                          if (1 < (ulong)((long)ppVar43 - (long)local_608.server_name.base)) {
                            lVar37 = 0;
                            uVar38 = 0;
                            do {
                              uVar38 = (ulong)*(byte *)((long)(ptls_aead_algorithm_t **)
                                                              local_608.server_name.base + lVar37) |
                                       uVar38 << 8;
                              lVar37 = lVar37 + 1;
                            } while (lVar37 != 2);
                            local_608.server_name.base =
                                 (uint8_t *)((long)local_608.server_name.base + 2);
                            if (uVar38 <= (ulong)((long)ppVar43 - (long)local_608.server_name.base))
                            {
                              ppVar33 = (ptls_key_exchange_algorithm_t *)
                                        (local_608.server_name.base + uVar38);
                              uVar31 = (*local_598)->aead->tag_size;
                              if (uVar31 <= uVar38) {
                                local_518.esni.encrypted_sni.base = local_608.server_name.base;
                                local_518.esni.encrypted_sni.len = uVar38;
                                local_608.server_name.base = (uint8_t *)ppVar33;
                              }
                              else {
                                uVar28 = 0x2f;
                              }
                              uVar25 = 0x32;
                              if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base ==
                                  ppVar33) {
                                uVar25 = uVar28;
                              }
                              bVar67 = (ptls_key_exchange_algorithm_t *)local_608.server_name.base
                                       != ppVar33;
                              if (uVar38 < uVar31) {
                                bVar67 = uVar31 > uVar38;
                                uVar25 = uVar28;
                              }
                            }
                          }
                          uVar28 = uVar25;
                          if (!bVar67) {
                            if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base !=
                                ppVar43) {
                              uVar28 = 0x32;
                              goto LAB_0011893b;
                            }
                            local_518.esni.cipher = *local_598;
                            bVar67 = false;
                          }
                        }
                      }
                      else {
LAB_0011893b:
                        bVar67 = true;
                      }
                    }
                  }
                  else {
                    uVar28 = 0x2f;
                    bVar67 = true;
                  }
                  if (bVar67) goto LAB_00117b80;
                }
LAB_00118b62:
                bVar67 = true;
                uVar25 = uVar28;
                local_608.server_name.base = (uint8_t *)ppVar43;
LAB_00118b6e:
                if ((!bVar67) ||
                   (bVar68 = (ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar36,
                   bVar68)) break;
              }
              bVar67 = uVar46 == 0x29;
            }
          }
          if ((bVar68) &&
             (uVar25 = 0x32, (ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar2))
          {
            lVar37 = 0;
            do {
              puVar54 = (uint16_t *)((long)supported_versions + lVar37);
              if (*puVar54 == local_518.selected_version) break;
              bVar68 = lVar37 != 6;
              lVar37 = lVar37 + 2;
            } while (bVar68);
            uVar25 = 0x46;
            if ((((*puVar54 == local_518.selected_version) &&
                 (uVar25 = 0x2f, local_518.compression_methods.count == 1)) &&
                (*(char *)(ptls_aead_algorithm_t **)local_518.compression_methods.ids == '\0')) &&
               ((local_518.esni.cipher == (ptls_cipher_suite_t *)0x0 ||
                ((ptls_key_exchange_algorithm_t *)local_518.key_shares.base !=
                 (ptls_key_exchange_algorithm_t *)0x0)))) {
              if ((ptls_key_exchange_algorithm_t *)local_518.psk.hash_end ==
                  (ptls_key_exchange_algorithm_t *)0x0) {
                if (local_518.psk.early_data_indication == 0) goto LAB_001199b2;
              }
              else if (bVar67) {
LAB_001199b2:
                uVar25 = 0;
              }
            }
          }
        }
      }
    }
  }
  ppVar11 = local_518.esni.cipher;
  puVar41 = local_518.random_bytes;
  if (uVar25 != 0) goto LAB_001176f2;
  ppVar6 = tls->ctx;
  if ((ppVar6->field_0x70 & 1) != 0) {
    local_518.psk.ke_modes = local_518.psk.ke_modes & 0xfffffffe;
  }
  if (eVar27 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    uVar17 = *(undefined8 *)local_518.random_bytes;
    ppVar18 = *(ptls_aead_algorithm_t **)((long)local_518.random_bytes + 8);
    iVar19 = *(intptr_t *)((long)local_518.random_bytes + 0x18);
    *(ptls_hash_algorithm_t **)(tls->client_random + 0x10) =
         *(ptls_hash_algorithm_t **)((long)local_518.random_bytes + 0x10);
    *(intptr_t *)(tls->client_random + 0x18) = iVar19;
    *(undefined8 *)tls->client_random = uVar17;
    *(ptls_aead_algorithm_t **)(tls->client_random + 8) = ppVar18;
    if (local_518.legacy_session_id.len != 0) {
      tls->field_0x160 = tls->field_0x160 | 4;
    }
    if ((local_518.esni.cipher != (ptls_cipher_suite_t *)0x0) &&
       (ppVar6->esni != (ptls_esni_context_t **)0x0)) {
      local_618 = (st_ptls_aead_context_t *)0x0;
      if (tls->esni != (ptls_esni_secret_t *)0x0) {
        __assert_fail("*secret == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                      ,0xbcd,
                      "int client_hello_decrypt_esni(ptls_context_t *, ptls_iovec_t *, ptls_esni_secret_t **, struct st_ptls_client_hello_t *)"
                     );
      }
      esni = &tls->esni;
      ppVar30 = (ptls_esni_secret_t *)malloc(0xd0);
      *esni = ppVar30;
      if (ppVar30 != (ptls_esni_secret_t *)0x0) {
        memset(ppVar30,0,0xd0);
        puVar3 = local_518.esni.record_digest;
        pppVar65 = ppVar6->esni;
        ppVar60 = *pppVar65;
        if (ppVar60 != (ptls_esni_context_t *)0x0) {
          bVar67 = false;
          do {
            paVar8 = ppVar60->cipher_suites;
            iVar23 = 4;
            if (paVar8->cipher_suite != (ptls_cipher_suite_t *)0x0) {
              if (paVar8->cipher_suite->id == ppVar11->id) {
                bVar68 = false;
                lVar37 = 0;
              }
              else {
                lVar37 = 0;
                paVar48 = paVar8;
                do {
                  paVar48 = paVar48 + 1;
                  bVar68 = paVar48->cipher_suite == (ptls_cipher_suite_t *)0x0;
                  if (bVar68) goto LAB_00117949;
                  lVar37 = lVar37 + 1;
                } while (paVar48->cipher_suite->id != ppVar11->id);
              }
              if (!bVar68) {
                iVar24 = bcmp(paVar8[lVar37].record_digest,puVar3,ppVar11->hash->digest_size);
                iVar23 = 0;
                if (iVar24 == 0) {
                  ppVar30->version = ppVar60->version;
                  iVar23 = 1;
                }
              }
            }
LAB_00117949:
            if (iVar23 != 0) {
              if ((iVar23 == 1) && (!bVar67)) {
                pppVar62 = ppVar60->key_exchanges;
                uVar25 = 0x2f;
                uVar28 = uVar25;
                if (*pppVar62 == (ptls_key_exchange_context_t *)0x0) goto LAB_00119a90;
                uVar5 = (local_518.esni.key_share)->id;
                if ((*pppVar62)->algo->id != uVar5) goto LAB_00118d1b;
                bVar67 = false;
                goto LAB_00118d33;
              }
              break;
            }
            ppVar60 = pppVar65[1];
            pppVar65 = pppVar65 + 1;
            bVar67 = ppVar60 == (ptls_esni_context_t *)0x0;
          } while (!bVar67);
        }
        goto LAB_00118d44;
      }
      uVar25 = 0x201;
      sVar45 = 0;
      ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
      goto LAB_00118db6;
    }
    bVar67 = true;
    ppVar36 = (ptls_key_exchange_algorithm_t *)local_518.server_name.base;
    sVar45 = local_518.server_name.len;
    if ((ptls_key_exchange_algorithm_t *)local_518.server_name.base ==
        (ptls_key_exchange_algorithm_t *)0x0) {
      ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
      sVar45 = 0;
    }
    bVar64 = 0;
    goto LAB_00117992;
  }
  uVar25 = 0x32;
  if (local_518.psk.early_data_indication != 0) goto LAB_001176f2;
  iVar23 = (*ptls_mem_equal)(tls->client_random,local_518.random_bytes,0x20);
  if (iVar23 == 0) {
    uVar25 = 0x28;
    goto LAB_001176f2;
  }
  pcVar7 = tls->server_name;
  if (pcVar7 != (char *)0x0) {
    sVar29 = strlen(pcVar7);
    if (local_518.server_name.len == sVar29) {
      iVar23 = bcmp(local_518.server_name.base,pcVar7,sVar29);
      bVar67 = iVar23 == 0;
      uVar25 = 0x28;
      if (bVar67) {
        uVar25 = 0;
      }
    }
    else {
      uVar25 = 0x28;
      bVar67 = false;
    }
    goto joined_r0x00118dce;
  }
  goto LAB_00118dd4;
  while (pppVar62 = pppVar62 + 1, (*pppVar1)->algo->id != uVar5) {
LAB_00118d1b:
    pppVar1 = pppVar62 + 1;
    bVar67 = *pppVar1 == (ptls_key_exchange_context_t *)0x0;
    if (bVar67) goto LAB_00118d44;
  }
LAB_00118d33:
  if (bVar67) {
LAB_00118d44:
    sVar45 = 0;
    local_688 = (ptls_key_exchange_algorithm_t *)0x0;
    ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
    uVar25 = 0x2f;
  }
  else {
    uVar28 = build_esni_contents_hash
                       (ppVar11->hash,ppVar30->esni_contents_hash,local_518.esni.record_digest,uVar5
                        ,local_518.esni.peer_key,puVar41);
    if (uVar28 == 0) {
      sVar45 = 0;
      uVar28 = (*(*pppVar62)->on_exchange)(pppVar62,0,&(*esni)->secret,local_518.esni.peer_key);
      ppVar11 = local_518.esni.cipher;
      if (uVar28 == 0) {
        sVar29 = (ulong)(*pppVar65)->padded_length + 0x10;
        sVar45 = 0;
        local_688 = (ptls_key_exchange_algorithm_t *)0x0;
        ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
        if (local_518.esni.encrypted_sni.len - (local_518.esni.cipher)->aead->tag_size == sVar29) {
          ppVar36 = (ptls_key_exchange_algorithm_t *)malloc(sVar29);
          if (ppVar36 == (ptls_key_exchange_algorithm_t *)0x0) {
            uVar28 = 0x201;
            goto LAB_00119a90;
          }
          uVar25 = create_esni_aead(&local_618,0,ppVar11,(*esni)->secret,(*esni)->esni_contents_hash
                                   );
          sVar63 = local_518.esni.encrypted_sni.len;
          puVar3 = local_518.esni.encrypted_sni.base;
          sVar45 = local_518.key_shares.len;
          puVar41 = local_518.key_shares.base;
          ppVar22 = local_618;
          local_688 = ppVar36;
          if (uVar25 == 0) {
            sVar44 = local_618->algo->iv_size;
            if (sVar44 - 8 != 0) {
              memcpy(&local_608,local_618->static_iv,sVar44 - 8);
            }
            lVar37 = -0x40;
            do {
              auStack_610[sVar44] = ppVar22->static_iv[sVar44 - 8];
              sVar44 = sVar44 + 1;
              lVar37 = lVar37 + 8;
            } while (lVar37 != 0);
            sVar45 = (*ppVar22->do_decrypt)(ppVar22,ppVar36,puVar3,sVar63,&local_608,puVar41,sVar45)
            ;
            if (sVar45 == (ulong)(*pppVar65)->padded_length + 0x10) {
              ptls_aead_free(ppVar22);
              local_618 = (st_ptls_aead_context_t *)0x0;
              uVar25 = 0x2f;
              local_580 = ppVar36;
              if (0xf < (ulong)(*pppVar65)->padded_length) {
                ppVar43 = (ptls_key_exchange_algorithm_t *)
                          ((long)&ppVar36->id + (ulong)(*pppVar65)->padded_length);
                ppVar30 = *esni;
                ppVar18 = (ptls_aead_algorithm_t *)ppVar36->create;
                *(undefined8 *)ppVar30->nonce = *(undefined8 *)ppVar36;
                *(ptls_aead_algorithm_t **)(ppVar30->nonce + 8) = ppVar18;
                local_580 = (ptls_key_exchange_algorithm_t *)&ppVar36->exchange;
                uVar25 = client_hello_decode_server_name
                                   (&local_608.server_name,(uint8_t **)&local_580,(uint8_t *)ppVar43
                                   );
                sVar45 = local_608.server_name.len;
                if (uVar25 == 0) {
                  for (; local_580 != ppVar43;
                      local_580 = (ptls_key_exchange_algorithm_t *)((long)&local_580->id + 1)) {
                    uVar25 = 0x2f;
                    if ((char)local_580->id != '\0') goto LAB_00119e48;
                  }
                  memmove(ppVar36,local_608.server_name.base,local_608.server_name.len);
                  uVar25 = 0;
                  local_688 = (ptls_key_exchange_algorithm_t *)0x0;
                }
                else {
                  sVar45 = 0;
                  ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
                }
                goto LAB_00118d54;
              }
            }
            else {
              uVar25 = 0x33;
            }
LAB_00119e48:
            sVar45 = 0;
            ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
          }
          else {
            sVar45 = 0;
            ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
          }
        }
      }
      else {
        local_688 = (ptls_key_exchange_algorithm_t *)0x0;
        ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
        uVar25 = uVar28;
      }
    }
    else {
LAB_00119a90:
      sVar45 = 0;
      local_688 = (ptls_key_exchange_algorithm_t *)0x0;
      ppVar36 = (ptls_key_exchange_algorithm_t *)0x0;
      uVar25 = uVar28;
    }
  }
LAB_00118d54:
  if (local_688 != (ptls_key_exchange_algorithm_t *)0x0) {
    free(local_688);
  }
  ppVar22 = local_618;
  if (local_618 != (st_ptls_aead_context_t *)0x0) {
    (*local_618->dispose_crypto)(local_618);
    (*ptls_clear_memory)(ppVar22->static_iv,ppVar22->algo->iv_size);
    free(ppVar22);
  }
  if ((uVar25 != 0) && (*esni != (ptls_esni_secret_t *)0x0)) {
    free_esni_secret(esni,1);
  }
LAB_00118db6:
  if (uVar25 == 0) {
    psVar12 = tls->ctx->update_esni_key;
    bVar64 = 1;
    if (psVar12 == (st_ptls_update_esni_key_t *)0x0) {
      bVar67 = false;
    }
    else {
      uVar25 = (*psVar12->cb)(psVar12,tls,tls->esni->secret,(local_518.esni.cipher)->hash,
                              tls->esni->esni_contents_hash);
      bVar67 = false;
      if (uVar25 != 0) goto joined_r0x00118dce;
    }
LAB_00117992:
    if (tls->ctx->on_client_hello == (ptls_on_client_hello_t *)0x0) {
      uVar25 = 0;
    }
    else {
      local_608.negotiated_protocols.list = local_518.alpn.list;
      local_608.negotiated_protocols.count = local_518.alpn.count;
      local_608.signature_algorithms.list = local_518.signature_algorithms.list;
      local_608.signature_algorithms.count = local_518.signature_algorithms.count;
      local_608.certificate_compression_algorithms.list = local_518.cert_compression_algos.list;
      local_608.certificate_compression_algorithms.count = local_518.cert_compression_algos.count;
      local_608.cipher_suites.list = local_518.client_ciphers.list;
      local_608.cipher_suites.count = local_518.client_ciphers.count;
      local_608._96_1_ = local_608._96_1_ & 0xfe | bVar64;
      psVar9 = tls->ctx->on_client_hello;
      local_608.server_name.base = (uint8_t *)ppVar36;
      local_608.server_name.len = sVar45;
      local_608.raw_message.base = puVar35;
      local_608.raw_message.len = sVar59;
      uVar25 = (*psVar9->cb)(psVar9,tls,&local_608);
    }
    if (!bVar67) {
      free(ppVar36);
    }
    bVar67 = uVar25 == 0;
  }
  else {
    bVar67 = false;
  }
joined_r0x00118dce:
  if (!bVar67) goto LAB_001176f2;
LAB_00118dd4:
  uVar25 = select_cipher((ptls_cipher_suite_t **)&local_608,tls->ctx->cipher_suites,
                         local_518.cipher_suites.base,
                         local_518.cipher_suites.base + local_518.cipher_suites.len);
  if (uVar25 == 0) {
    if (eVar27 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
      if ((ptls_key_exchange_algorithm_t *)tls->cipher_suite !=
          (ptls_key_exchange_algorithm_t *)local_608.server_name.base) {
        uVar25 = 0x28;
        bVar67 = false;
        goto LAB_00118ee9;
      }
    }
    else {
      tls->cipher_suite = (ptls_cipher_suite_t *)local_608.server_name.base;
      ppVar34 = key_schedule_new((ptls_cipher_suite_t *)local_608.server_name.base,
                                 (ptls_cipher_suite_t **)0x0,tls->ctx->hkdf_label_prefix__obsolete);
      tls->key_schedule = ppVar34;
    }
    uVar25 = 0;
    bVar67 = true;
  }
  else {
    bVar67 = false;
  }
LAB_00118ee9:
  if (!bVar67) goto LAB_001176f2;
  if ((ptls_key_exchange_algorithm_t *)local_518.key_shares.base !=
      (ptls_key_exchange_algorithm_t *)0x0 && local_568 == (ptls_key_exchange_algorithm_t *)0x0) {
    local_608.server_name.base = local_518.key_shares.base;
    ppVar36 = (ptls_key_exchange_algorithm_t *)
              ((long)(ptls_aead_algorithm_t **)local_518.key_shares.base + local_518.key_shares.len)
    ;
    if (local_518.key_shares.len < 2) {
      uVar28 = 0;
      uVar25 = 0x32;
    }
    else {
      lVar37 = 0;
      uVar38 = 0;
      do {
        uVar38 = (ulong)*(byte *)((long)(ptls_aead_algorithm_t **)local_518.key_shares.base + lVar37
                                 ) | uVar38 << 8;
        lVar37 = lVar37 + 1;
      } while (lVar37 != 2);
      local_608.server_name.base = (uint8_t *)((long)local_518.key_shares.base + 2);
      uVar28 = 0;
      uVar25 = 0x32;
      if (uVar38 <= (ulong)((long)ppVar36 - (long)local_608.server_name.base)) {
        ppVar43 = (ptls_key_exchange_algorithm_t *)(local_608.server_name.base + uVar38);
        uVar26 = select_key_share(&local_568,&pStack_560,tls->ctx->key_exchanges,
                                  (uint8_t **)&local_608,(uint8_t *)ppVar43,0);
        uVar25 = 0x32;
        if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar43) {
          uVar25 = uVar28;
        }
        if (uVar26 != 0) {
          uVar25 = uVar26;
        }
        uVar28 = (uint)(uVar26 == 0 &&
                       (ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar43);
      }
    }
    uVar26 = 0x32;
    if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base == ppVar36) {
      uVar26 = uVar25;
    }
    if (((char)uVar28 == '\0') ||
       (uVar25 = uVar26, (ptls_key_exchange_algorithm_t *)local_608.server_name.base != ppVar36))
    goto LAB_001176f2;
  }
  ppVar36 = local_568;
  if (eVar27 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    if (local_568 == (ptls_key_exchange_algorithm_t *)0x0 || local_518.cookie.all.len == 0) {
      if ((local_568 == (ptls_key_exchange_algorithm_t *)0x0) ||
         ((properties != (ptls_handshake_properties_t *)0x0 &&
          ((*(byte *)((long)&properties->field_0 + 0x60) & 1) != 0)))) {
        if ((ptls_key_exchange_algorithm_t *)local_518.negotiated_groups.base ==
            (ptls_key_exchange_algorithm_t *)0x0) {
          uVar25 = 0x6d;
          goto LAB_001176f2;
        }
        uVar25 = select_negotiated_group
                           ((ptls_key_exchange_algorithm_t **)&local_608,tls->ctx->key_exchanges,
                            local_518.negotiated_groups.base,
                            (uint8_t *)
                            ((long)(ptls_aead_algorithm_t **)local_518.negotiated_groups.base +
                            local_518.negotiated_groups.len));
        if (uVar25 == 0) {
          ppVar34 = tls->key_schedule;
          if (ppVar34->num_hashes != 0) {
            pppVar58 = &ppVar34->hashes[0].ctx;
            sVar45 = 0;
            do {
              (*(*pppVar58)->update)(*pppVar58,puVar35,sVar59);
              sVar45 = sVar45 + 1;
              pppVar58 = pppVar58 + 2;
            } while (sVar45 != ppVar34->num_hashes);
          }
          if (tls->key_schedule->generation != 0) {
            __assert_fail("tls->key_schedule->generation == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                          ,0xebe,
                          "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                         );
          }
          if ((properties == (ptls_handshake_properties_t *)0x0) ||
             ((*(byte *)((long)&properties->field_0 + 0x60) & 2) == 0)) {
            key_schedule_transform_post_ch1hash(tls->key_schedule);
            key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
            uVar25 = (*emitter->begin_message)(emitter);
            if (uVar25 == 0) {
              ppVar15 = emitter->buf;
              ppVar34 = tls->key_schedule;
              sVar59 = ppVar15->off;
              uVar25 = ptls_buffer_reserve(ppVar15,1);
              if (uVar25 == 0) {
                ppVar15->base[ppVar15->off] = '\x02';
                ppVar15->off = ppVar15->off + 1;
                uVar25 = 0;
              }
              bVar67 = true;
              if (uVar25 == 0) {
                uVar25 = ptls_buffer_reserve(ppVar15,3);
                if (uVar25 == 0) {
                  puVar35 = ppVar15->base;
                  sVar45 = ppVar15->off;
                  puVar35[sVar45 + 2] = '\0';
                  puVar35 = puVar35 + sVar45;
                  puVar35[0] = '\0';
                  puVar35[1] = '\0';
                  ppVar15->off = ppVar15->off + 3;
                  uVar25 = 0;
                }
                bVar67 = true;
                if (uVar25 == 0) {
                  local_628 = ppVar15->off;
                  ppVar16 = emitter->buf;
                  uVar25 = ptls_buffer_reserve(ppVar16,2);
                  if (uVar25 == 0) {
                    puVar35 = ppVar16->base;
                    sVar45 = ppVar16->off;
                    (puVar35 + sVar45)[0] = '\x03';
                    (puVar35 + sVar45)[1] = '\x03';
                    ppVar16->off = ppVar16->off + 2;
                    uVar25 = 0;
                  }
                  bVar67 = uVar25 != 0;
                  if ((uVar25 == 0) &&
                     (uVar25 = ptls_buffer_reserve(emitter->buf,0x20), bVar67 = true, uVar25 == 0))
                  {
                    puVar35 = emitter->buf->base;
                    sVar45 = emitter->buf->off;
                    puVar41 = puVar35 + sVar45 + 0x10;
                    puVar41[0] = 0xc2;
                    puVar41[1] = 0xa2;
                    puVar41[2] = '\x11';
                    puVar41[3] = '\x16';
                    puVar41[4] = 'z';
                    puVar41[5] = 0xbb;
                    puVar41[6] = 0x8c;
                    puVar41[7] = '^';
                    puVar41[8] = '\a';
                    puVar41[9] = 0x9e;
                    puVar41[10] = '\t';
                    puVar41[0xb] = 0xe2;
                    puVar41[0xc] = 200;
                    puVar41[0xd] = 0xa8;
                    puVar41[0xe] = '3';
                    puVar41[0xf] = 0x9c;
                    puVar35 = puVar35 + sVar45;
                    puVar35[0] = 0xcf;
                    puVar35[1] = '!';
                    puVar35[2] = 0xad;
                    puVar35[3] = 't';
                    puVar35[4] = 0xe5;
                    puVar35[5] = 0x9a;
                    puVar35[6] = 'a';
                    puVar35[7] = '\x11';
                    puVar35[8] = 0xbe;
                    puVar35[9] = '\x1d';
                    puVar35[10] = 0x8c;
                    puVar35[0xb] = '\x02';
                    puVar35[0xc] = '\x1e';
                    puVar35[0xd] = 'e';
                    puVar35[0xe] = 0xb8;
                    puVar35[0xf] = 0x91;
                    ppVar16 = emitter->buf;
                    ppVar16->off = ppVar16->off + 0x20;
                    uVar25 = ptls_buffer_reserve(ppVar16,1);
                    if (uVar25 == 0) {
                      ppVar16->base[ppVar16->off] = '\0';
                      ppVar16->off = ppVar16->off + 1;
                      uVar25 = 0;
                    }
                    bVar67 = true;
                    if (uVar25 == 0) {
                      sVar45 = emitter->buf->off;
                      uVar28 = ptls_buffer__do_pushv
                                         (emitter->buf,local_518.legacy_session_id.base,
                                          local_518.legacy_session_id.len);
                      uVar25 = 0;
                      if (uVar28 == 0) {
                        emitter->buf->base[sVar45 - 1] = (char)(int)emitter->buf->off - (char)sVar45
                        ;
                        bVar66 = true;
                        bVar67 = false;
                      }
                      else {
                        bVar66 = false;
                        uVar25 = uVar28;
                      }
                    }
                    else {
                      bVar66 = false;
                    }
                    if (bVar66) {
                      uVar46 = tls->cipher_suite->id;
                      ppVar16 = emitter->buf;
                      uVar25 = ptls_buffer_reserve(ppVar16,2);
                      if (uVar25 == 0) {
                        *(ushort *)(ppVar16->base + ppVar16->off) = uVar46 << 8 | uVar46 >> 8;
                        ppVar16->off = ppVar16->off + 2;
                        uVar25 = 0;
                      }
                      bVar67 = uVar25 != 0;
                      if (uVar25 == 0) {
                        ppVar16 = emitter->buf;
                        uVar25 = ptls_buffer_reserve(ppVar16,1);
                        if (uVar25 == 0) {
                          ppVar16->base[ppVar16->off] = '\0';
                          ppVar16->off = ppVar16->off + 1;
                          uVar25 = 0;
                        }
                        bVar67 = true;
                        if (uVar25 == 0) {
                          ppVar16 = emitter->buf;
                          uVar25 = ptls_buffer_reserve(ppVar16,2);
                          if (uVar25 == 0) {
                            puVar35 = ppVar16->base;
                            sVar45 = ppVar16->off;
                            (puVar35 + sVar45)[0] = '\0';
                            (puVar35 + sVar45)[1] = '\0';
                            ppVar16->off = ppVar16->off + 2;
                            uVar25 = 0;
                          }
                          bVar67 = true;
                          if (uVar25 == 0) {
                            ppVar16 = emitter->buf;
                            local_680 = ppVar16->off;
                            uVar25 = ptls_buffer_reserve(ppVar16,2);
                            if (uVar25 == 0) {
                              puVar35 = ppVar16->base;
                              sVar45 = ppVar16->off;
                              (puVar35 + sVar45)[0] = '\0';
                              (puVar35 + sVar45)[1] = '+';
                              ppVar16->off = ppVar16->off + 2;
                              uVar25 = 0;
                            }
                            bVar67 = uVar25 != 0;
                            if (uVar25 == 0) {
                              ppVar16 = emitter->buf;
                              uVar25 = ptls_buffer_reserve(ppVar16,2);
                              uVar5 = local_518.selected_version;
                              if (uVar25 == 0) {
                                puVar35 = ppVar16->base;
                                sVar45 = ppVar16->off;
                                (puVar35 + sVar45)[0] = '\0';
                                (puVar35 + sVar45)[1] = '\0';
                                ppVar16->off = ppVar16->off + 2;
                                uVar25 = 0;
                              }
                              bVar67 = true;
                              if (uVar25 == 0) {
                                ppVar16 = emitter->buf;
                                sVar45 = ppVar16->off;
                                uVar25 = ptls_buffer_reserve(ppVar16,2);
                                if (uVar25 == 0) {
                                  *(uint16_t *)(ppVar16->base + ppVar16->off) =
                                       uVar5 << 8 | uVar5 >> 8;
                                  ppVar16->off = ppVar16->off + 2;
                                  uVar25 = 0;
                                }
                                bVar67 = uVar25 != 0;
                                if (uVar25 == 0) {
                                  uVar38 = emitter->buf->off - sVar45;
                                  lVar37 = 8;
                                  do {
                                    emitter->buf->base[sVar45 - 2] =
                                         (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                    lVar37 = lVar37 + -8;
                                    sVar45 = sVar45 + 1;
                                  } while (lVar37 != -8);
                                  bVar67 = false;
                                }
                              }
                              puVar35 = local_608.server_name.base;
                              if (!bVar67) {
                                if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base ==
                                    (ptls_key_exchange_algorithm_t *)0x0 ||
                                    ppVar36 != (ptls_key_exchange_algorithm_t *)0x0) {
LAB_0011b44a:
                                  bVar67 = false;
                                }
                                else {
                                  ppVar16 = emitter->buf;
                                  uVar25 = ptls_buffer_reserve(ppVar16,2);
                                  if (uVar25 == 0) {
                                    puVar41 = ppVar16->base;
                                    sVar45 = ppVar16->off;
                                    (puVar41 + sVar45)[0] = '\0';
                                    (puVar41 + sVar45)[1] = '3';
                                    ppVar16->off = ppVar16->off + 2;
                                    uVar25 = 0;
                                  }
                                  bVar67 = uVar25 != 0;
                                  if (uVar25 == 0) {
                                    ppVar16 = emitter->buf;
                                    uVar25 = ptls_buffer_reserve(ppVar16,2);
                                    if (uVar25 == 0) {
                                      puVar41 = ppVar16->base;
                                      sVar45 = ppVar16->off;
                                      (puVar41 + sVar45)[0] = '\0';
                                      (puVar41 + sVar45)[1] = '\0';
                                      ppVar16->off = ppVar16->off + 2;
                                      uVar25 = 0;
                                    }
                                    bVar67 = true;
                                    if (uVar25 == 0) {
                                      ppVar16 = emitter->buf;
                                      sVar45 = ppVar16->off;
                                      uVar46 = *(ushort *)(ptls_aead_algorithm_t **)puVar35;
                                      uVar25 = ptls_buffer_reserve(ppVar16,2);
                                      if (uVar25 == 0) {
                                        *(ushort *)(ppVar16->base + ppVar16->off) =
                                             uVar46 << 8 | uVar46 >> 8;
                                        ppVar16->off = ppVar16->off + 2;
                                        uVar25 = 0;
                                      }
                                      bVar67 = uVar25 != 0;
                                      if (!bVar67) {
                                        uVar38 = emitter->buf->off - sVar45;
                                        lVar37 = 8;
                                        do {
                                          emitter->buf->base[sVar45 - 2] =
                                               (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                          lVar37 = lVar37 + -8;
                                          sVar45 = sVar45 + 1;
                                        } while (lVar37 != -8);
                                        goto LAB_0011b44a;
                                      }
                                    }
                                  }
                                }
                                if (!bVar67) {
                                  uVar38 = emitter->buf->off - local_680;
                                  lVar37 = 8;
                                  do {
                                    emitter->buf->base[local_680 - 2] =
                                         (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                    lVar37 = lVar37 + -8;
                                    local_680 = local_680 + 1;
                                    bVar67 = false;
                                  } while (lVar37 != -8);
                                }
                              }
                            }
                          }
                          if (!bVar67) {
                            uVar38 = ppVar15->off - local_628;
                            lVar37 = 0x10;
                            do {
                              ppVar15->base[local_628 - 3] =
                                   (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                              lVar37 = lVar37 + -8;
                              local_628 = local_628 + 1;
                              bVar67 = false;
                            } while (lVar37 != -8);
                          }
                        }
                      }
                    }
                  }
                }
                if (((!bVar67) && (bVar67 = false, ppVar34 != (ptls_key_schedule_t *)0x0)) &&
                   (ppVar34->num_hashes != 0)) {
                  puVar35 = ppVar15->base;
                  sVar45 = ppVar15->off;
                  pppVar58 = &ppVar34->hashes[0].ctx;
                  bVar67 = false;
                  sVar63 = 0;
                  do {
                    (*(*pppVar58)->update)(*pppVar58,puVar35 + sVar59,sVar45 - sVar59);
                    sVar63 = sVar63 + 1;
                    pppVar58 = pppVar58 + 2;
                  } while (sVar63 != ppVar34->num_hashes);
                }
              }
              if (!bVar67) {
                uVar25 = (*emitter->commit_message)(emitter);
                bVar67 = uVar25 != 0;
              }
            }
            else {
              bVar67 = true;
            }
            if (!bVar67) {
              uVar25 = push_change_cipher_spec(tls,emitter);
              bVar67 = true;
              if (uVar25 == 0) {
                tls->state = PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                uVar25 = 0x202;
                if (local_518.psk.early_data_indication != 0) {
                  (tls->field_18).server.early_data_skipped_bytes = 0;
                }
              }
            }
          }
          else {
            uVar25 = (*emitter->begin_message)(emitter);
            if (uVar25 == 0) {
              ppVar15 = emitter->buf;
              uVar25 = ptls_buffer_reserve(ppVar15,1);
              if (uVar25 == 0) {
                ppVar15->base[ppVar15->off] = '\x02';
                ppVar15->off = ppVar15->off + 1;
                uVar25 = 0;
              }
              bVar66 = true;
              bVar67 = bVar66;
              if (uVar25 == 0) {
                uVar25 = ptls_buffer_reserve(ppVar15,3);
                if (uVar25 == 0) {
                  puVar35 = ppVar15->base;
                  sVar59 = ppVar15->off;
                  puVar35[sVar59 + 2] = '\0';
                  puVar35 = puVar35 + sVar59;
                  puVar35[0] = '\0';
                  puVar35[1] = '\0';
                  ppVar15->off = ppVar15->off + 3;
                  uVar25 = 0;
                }
                if (uVar25 == 0) {
                  sVar59 = ppVar15->off;
                  ppVar16 = emitter->buf;
                  uVar25 = ptls_buffer_reserve(ppVar16,2);
                  if (uVar25 == 0) {
                    puVar35 = ppVar16->base;
                    sVar45 = ppVar16->off;
                    (puVar35 + sVar45)[0] = '\x03';
                    (puVar35 + sVar45)[1] = '\x03';
                    ppVar16->off = ppVar16->off + 2;
                    uVar25 = 0;
                  }
                  bVar67 = uVar25 != 0;
                  if ((uVar25 == 0) &&
                     (uVar25 = ptls_buffer_reserve(emitter->buf,0x20), bVar67 = bVar66, uVar25 == 0)
                     ) {
                    puVar35 = emitter->buf->base;
                    sVar45 = emitter->buf->off;
                    puVar41 = puVar35 + sVar45 + 0x10;
                    puVar41[0] = 0xc2;
                    puVar41[1] = 0xa2;
                    puVar41[2] = '\x11';
                    puVar41[3] = '\x16';
                    puVar41[4] = 'z';
                    puVar41[5] = 0xbb;
                    puVar41[6] = 0x8c;
                    puVar41[7] = '^';
                    puVar41[8] = '\a';
                    puVar41[9] = 0x9e;
                    puVar41[10] = '\t';
                    puVar41[0xb] = 0xe2;
                    puVar41[0xc] = 200;
                    puVar41[0xd] = 0xa8;
                    puVar41[0xe] = '3';
                    puVar41[0xf] = 0x9c;
                    puVar35 = puVar35 + sVar45;
                    puVar35[0] = 0xcf;
                    puVar35[1] = '!';
                    puVar35[2] = 0xad;
                    puVar35[3] = 't';
                    puVar35[4] = 0xe5;
                    puVar35[5] = 0x9a;
                    puVar35[6] = 'a';
                    puVar35[7] = '\x11';
                    puVar35[8] = 0xbe;
                    puVar35[9] = '\x1d';
                    puVar35[10] = 0x8c;
                    puVar35[0xb] = '\x02';
                    puVar35[0xc] = '\x1e';
                    puVar35[0xd] = 'e';
                    puVar35[0xe] = 0xb8;
                    puVar35[0xf] = 0x91;
                    ppVar16 = emitter->buf;
                    ppVar16->off = ppVar16->off + 0x20;
                    uVar25 = ptls_buffer_reserve(ppVar16,1);
                    if (uVar25 == 0) {
                      ppVar16->base[ppVar16->off] = '\0';
                      ppVar16->off = ppVar16->off + 1;
                      uVar25 = 0;
                    }
                    bVar67 = true;
                    if (uVar25 == 0) {
                      sVar45 = emitter->buf->off;
                      uVar28 = ptls_buffer__do_pushv
                                         (emitter->buf,local_518.legacy_session_id.base,
                                          local_518.legacy_session_id.len);
                      uVar25 = 0;
                      if (uVar28 == 0) {
                        emitter->buf->base[sVar45 - 1] = (char)(int)emitter->buf->off - (char)sVar45
                        ;
                        bVar66 = true;
                        bVar67 = false;
                      }
                      else {
                        bVar66 = false;
                        uVar25 = uVar28;
                      }
                    }
                    else {
                      bVar66 = false;
                    }
                    if (bVar66) {
                      uVar46 = tls->cipher_suite->id;
                      ppVar16 = emitter->buf;
                      uVar25 = ptls_buffer_reserve(ppVar16,2);
                      if (uVar25 == 0) {
                        *(ushort *)(ppVar16->base + ppVar16->off) = uVar46 << 8 | uVar46 >> 8;
                        ppVar16->off = ppVar16->off + 2;
                        uVar25 = 0;
                      }
                      bVar67 = uVar25 != 0;
                      if (uVar25 == 0) {
                        ppVar16 = emitter->buf;
                        uVar25 = ptls_buffer_reserve(ppVar16,1);
                        if (uVar25 == 0) {
                          ppVar16->base[ppVar16->off] = '\0';
                          ppVar16->off = ppVar16->off + 1;
                          uVar25 = 0;
                        }
                        bVar67 = true;
                        if (uVar25 == 0) {
                          ppVar16 = emitter->buf;
                          uVar25 = ptls_buffer_reserve(ppVar16,2);
                          if (uVar25 == 0) {
                            puVar35 = ppVar16->base;
                            sVar45 = ppVar16->off;
                            (puVar35 + sVar45)[0] = '\0';
                            (puVar35 + sVar45)[1] = '\0';
                            ppVar16->off = ppVar16->off + 2;
                            uVar25 = 0;
                          }
                          bVar67 = true;
                          if (uVar25 == 0) {
                            ppVar16 = emitter->buf;
                            local_628 = ppVar16->off;
                            uVar25 = ptls_buffer_reserve(ppVar16,2);
                            if (uVar25 == 0) {
                              puVar35 = ppVar16->base;
                              sVar45 = ppVar16->off;
                              (puVar35 + sVar45)[0] = '\0';
                              (puVar35 + sVar45)[1] = '+';
                              ppVar16->off = ppVar16->off + 2;
                              uVar25 = 0;
                            }
                            bVar67 = uVar25 != 0;
                            if (uVar25 == 0) {
                              ppVar16 = emitter->buf;
                              uVar25 = ptls_buffer_reserve(ppVar16,2);
                              uVar5 = local_518.selected_version;
                              if (uVar25 == 0) {
                                puVar35 = ppVar16->base;
                                sVar45 = ppVar16->off;
                                (puVar35 + sVar45)[0] = '\0';
                                (puVar35 + sVar45)[1] = '\0';
                                ppVar16->off = ppVar16->off + 2;
                                uVar25 = 0;
                              }
                              bVar67 = true;
                              if (uVar25 == 0) {
                                ppVar16 = emitter->buf;
                                sVar45 = ppVar16->off;
                                uVar25 = ptls_buffer_reserve(ppVar16,2);
                                if (uVar25 == 0) {
                                  *(uint16_t *)(ppVar16->base + ppVar16->off) =
                                       uVar5 << 8 | uVar5 >> 8;
                                  ppVar16->off = ppVar16->off + 2;
                                  uVar25 = 0;
                                }
                                bVar67 = uVar25 != 0;
                                if (uVar25 == 0) {
                                  uVar38 = emitter->buf->off - sVar45;
                                  lVar37 = 8;
                                  do {
                                    emitter->buf->base[sVar45 - 2] =
                                         (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                    lVar37 = lVar37 + -8;
                                    sVar45 = sVar45 + 1;
                                  } while (lVar37 != -8);
                                  bVar67 = false;
                                }
                              }
                              puVar35 = local_608.server_name.base;
                              if (!bVar67) {
                                if ((ptls_key_exchange_algorithm_t *)local_608.server_name.base ==
                                    (ptls_key_exchange_algorithm_t *)0x0 ||
                                    ppVar36 != (ptls_key_exchange_algorithm_t *)0x0) {
LAB_0011b743:
                                  ppVar16 = emitter->buf;
                                  uVar25 = ptls_buffer_reserve(ppVar16,2);
                                  if (uVar25 == 0) {
                                    puVar41 = ppVar16->base;
                                    sVar45 = ppVar16->off;
                                    (puVar41 + sVar45)[0] = '\0';
                                    (puVar41 + sVar45)[1] = ',';
                                    ppVar16->off = ppVar16->off + 2;
                                    uVar25 = 0;
                                  }
                                  bVar67 = uVar25 != 0;
                                  if (!bVar67) {
                                    uVar25 = ptls_buffer_reserve(ppVar16,2);
                                    if (uVar25 == 0) {
                                      puVar41 = ppVar16->base;
                                      sVar45 = ppVar16->off;
                                      (puVar41 + sVar45)[0] = '\0';
                                      (puVar41 + sVar45)[1] = '\0';
                                      ppVar16->off = ppVar16->off + 2;
                                      uVar25 = 0;
                                    }
                                    bVar67 = true;
                                    if (uVar25 == 0) {
                                      sVar45 = ppVar16->off;
                                      uVar25 = ptls_buffer_reserve(ppVar16,2);
                                      if (uVar25 == 0) {
                                        puVar41 = ppVar16->base;
                                        sVar63 = ppVar16->off;
                                        (puVar41 + sVar63)[0] = '\0';
                                        (puVar41 + sVar63)[1] = '\0';
                                        ppVar16->off = ppVar16->off + 2;
                                        uVar25 = 0;
                                      }
                                      bVar67 = true;
                                      if (uVar25 == 0) {
                                        local_668 = ppVar16->off;
                                        uVar25 = ptls_buffer_reserve(ppVar16,2);
                                        if (uVar25 == 0) {
                                          puVar41 = ppVar16->base;
                                          sVar63 = ppVar16->off;
                                          (puVar41 + sVar63)[0] = '\0';
                                          (puVar41 + sVar63)[1] = '\0';
                                          ppVar16->off = ppVar16->off + 2;
                                          uVar25 = 0;
                                        }
                                        bVar67 = true;
                                        if (uVar25 == 0) {
                                          local_660 = ppVar16->off;
                                          uVar25 = ptls_buffer_reserve(ppVar16,1);
                                          if (uVar25 == 0) {
                                            ppVar16->base[ppVar16->off] = '\0';
                                            ppVar16->off = ppVar16->off + 1;
                                            uVar25 = 0;
                                          }
                                          bVar67 = true;
                                          if (uVar25 == 0) {
                                            sVar63 = ppVar16->off;
                                            sVar44 = tls->cipher_suite->hash->digest_size;
                                            uVar25 = ptls_buffer_reserve(ppVar16,sVar44);
                                            bVar67 = true;
                                            if (uVar25 == 0) {
                                              psVar14 = tls->key_schedule->hashes[0].ctx;
                                              (*psVar14->final)(psVar14,ppVar16->base + ppVar16->off
                                                                ,PTLS_HASH_FINAL_MODE_RESET);
                                              ppVar16->off = ppVar16->off + sVar44;
                                              ppVar16->base[sVar63 - 1] =
                                                   (char)(int)ppVar16->off - (char)sVar63;
                                              bVar67 = false;
                                            }
                                          }
                                          ppVar2 = local_568;
                                          if (!bVar67) {
                                            uVar25 = ptls_buffer_reserve(ppVar16,1);
                                            if (uVar25 == 0) {
                                              ppVar16->base[ppVar16->off] =
                                                   ppVar2 == (ptls_key_exchange_algorithm_t *)0x0;
                                              ppVar16->off = ppVar16->off + 1;
                                              uVar25 = 0;
                                            }
                                            bVar67 = true;
                                            if (uVar25 == 0) {
                                              uVar38 = ppVar16->off - local_660;
                                              lVar37 = 8;
                                              do {
                                                ppVar16->base[local_660 - 2] =
                                                     (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                                lVar37 = lVar37 + -8;
                                                local_660 = local_660 + 1;
                                              } while (lVar37 != -8);
                                              bVar67 = false;
                                              uVar25 = 0;
                                            }
                                          }
                                        }
                                        if (!bVar67) {
                                          sVar63 = ppVar16->off;
                                          uVar25 = ptls_buffer_reserve(ppVar16,1);
                                          if (uVar25 == 0) {
                                            ppVar16->base[ppVar16->off] = '\0';
                                            ppVar16->off = ppVar16->off + 1;
                                            uVar25 = 0;
                                          }
                                          bVar67 = true;
                                          if (uVar25 == 0) {
                                            sVar44 = ppVar16->off;
                                            delta = (*tls->ctx->cipher_suites)->hash->digest_size;
                                            uVar25 = ptls_buffer_reserve(ppVar16,delta);
                                            bVar67 = true;
                                            if (uVar25 == 0) {
                                              tbs_00.len = sVar63 - local_668;
                                              tbs_00.base = ppVar16->base + local_668;
                                              uVar28 = calc_cookie_signature
                                                                 (tls,properties,
                                                                  (ptls_key_exchange_algorithm_t *)
                                                                  puVar35,tbs_00,
                                                                  ppVar16->base + ppVar16->off);
                                              uVar25 = 0;
                                              if (uVar28 == 0) {
                                                ppVar16->off = ppVar16->off + delta;
                                                bVar66 = true;
                                                bVar67 = false;
                                              }
                                              else {
                                                bVar66 = false;
                                                uVar25 = uVar28;
                                              }
                                            }
                                            else {
                                              bVar66 = false;
                                            }
                                            if (bVar66) {
                                              ppVar16->base[sVar44 - 1] =
                                                   (char)(int)ppVar16->off - (char)sVar44;
                                              bVar67 = false;
                                            }
                                          }
                                        }
                                        if (!bVar67) {
                                          uVar38 = ppVar16->off - local_668;
                                          lVar37 = 8;
                                          do {
                                            ppVar16->base[local_668 - 2] =
                                                 (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                            lVar37 = lVar37 + -8;
                                            local_668 = local_668 + 1;
                                          } while (lVar37 != -8);
                                          bVar67 = false;
                                        }
                                      }
                                      if (!bVar67) {
                                        uVar38 = ppVar16->off - sVar45;
                                        lVar37 = 8;
                                        do {
                                          ppVar16->base[sVar45 - 2] =
                                               (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                          lVar37 = lVar37 + -8;
                                          sVar45 = sVar45 + 1;
                                          bVar67 = false;
                                        } while (lVar37 != -8);
                                      }
                                    }
                                  }
                                }
                                else {
                                  ppVar16 = emitter->buf;
                                  uVar25 = ptls_buffer_reserve(ppVar16,2);
                                  if (uVar25 == 0) {
                                    puVar41 = ppVar16->base;
                                    sVar45 = ppVar16->off;
                                    (puVar41 + sVar45)[0] = '\0';
                                    (puVar41 + sVar45)[1] = '3';
                                    ppVar16->off = ppVar16->off + 2;
                                    uVar25 = 0;
                                  }
                                  bVar67 = uVar25 != 0;
                                  if (!bVar67) {
                                    ppVar16 = emitter->buf;
                                    uVar25 = ptls_buffer_reserve(ppVar16,2);
                                    if (uVar25 == 0) {
                                      puVar41 = ppVar16->base;
                                      sVar45 = ppVar16->off;
                                      (puVar41 + sVar45)[0] = '\0';
                                      (puVar41 + sVar45)[1] = '\0';
                                      ppVar16->off = ppVar16->off + 2;
                                      uVar25 = 0;
                                    }
                                    bVar67 = true;
                                    if (uVar25 == 0) {
                                      ppVar16 = emitter->buf;
                                      sVar45 = ppVar16->off;
                                      uVar46 = *(uint16_t *)puVar35;
                                      uVar25 = ptls_buffer_reserve(ppVar16,2);
                                      if (uVar25 == 0) {
                                        *(ushort *)(ppVar16->base + ppVar16->off) =
                                             uVar46 << 8 | uVar46 >> 8;
                                        ppVar16->off = ppVar16->off + 2;
                                        uVar25 = 0;
                                      }
                                      bVar67 = uVar25 != 0;
                                      if (uVar25 == 0) {
                                        uVar38 = emitter->buf->off - sVar45;
                                        lVar37 = 8;
                                        do {
                                          emitter->buf->base[sVar45 - 2] =
                                               (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                          lVar37 = lVar37 + -8;
                                          sVar45 = sVar45 + 1;
                                        } while (lVar37 != -8);
                                        bVar67 = false;
                                      }
                                    }
                                    if (!bVar67) goto LAB_0011b743;
                                  }
                                }
                                if (!bVar67) {
                                  uVar38 = emitter->buf->off - local_628;
                                  lVar37 = 8;
                                  do {
                                    emitter->buf->base[local_628 - 2] =
                                         (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                    lVar37 = lVar37 + -8;
                                    local_628 = local_628 + 1;
                                    bVar67 = false;
                                  } while (lVar37 != -8);
                                }
                              }
                            }
                          }
                          if (!bVar67) {
                            uVar38 = ppVar15->off - sVar59;
                            lVar37 = 0x10;
                            do {
                              ppVar15->base[sVar59 - 3] = (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f))
                              ;
                              lVar37 = lVar37 + -8;
                              sVar59 = sVar59 + 1;
                              bVar67 = false;
                            } while (lVar37 != -8);
                          }
                        }
                      }
                    }
                  }
                }
              }
              if (!bVar67) {
                uVar25 = (*emitter->commit_message)(emitter);
                bVar67 = uVar25 != 0;
              }
            }
            else {
              bVar67 = true;
            }
            if (!bVar67) {
              uVar28 = push_change_cipher_spec(tls,emitter);
              uVar25 = 0x206;
              if (uVar28 != 0) {
                uVar25 = uVar28;
              }
              goto LAB_0011930b;
            }
          }
        }
        else {
LAB_0011930b:
          bVar67 = true;
        }
joined_r0x00119315:
        if (!bVar67) {
          return uVar25;
        }
        goto LAB_001176f2;
      }
    }
    else {
      sVar45 = (*tls->ctx->cipher_suites)->hash->digest_size;
      tbs.len = local_518.cookie.tbs.len;
      tbs.base = local_518.cookie.tbs.base;
      uVar25 = calc_cookie_signature(tls,properties,local_568,tbs,(uint8_t *)&local_608);
      bVar67 = true;
      if (((uVar25 == 0) && (uVar25 = 0x28, local_518.cookie.signature.len == sVar45)) &&
         (iVar23 = (*ptls_mem_equal)(local_518.cookie.signature.base,&local_608,sVar45), iVar23 != 0
         )) {
        key_schedule_update_ch1hash_prefix(tls->key_schedule);
        sVar45 = local_518.cookie.ch1_hash.len;
        puVar41 = local_518.cookie.ch1_hash.base;
        ppVar34 = tls->key_schedule;
        if (ppVar34->num_hashes != 0) {
          pppVar58 = &ppVar34->hashes[0].ctx;
          sVar63 = 0;
          do {
            (*(*pppVar58)->update)(*pppVar58,puVar41,sVar45);
            sVar63 = sVar63 + 1;
            pppVar58 = pppVar58 + 2;
          } while (sVar63 != ppVar34->num_hashes);
        }
        key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
        sVar45 = emitter->buf->off;
        uVar25 = (*emitter->begin_message)(emitter);
        if (uVar25 == 0) {
          ppVar15 = emitter->buf;
          ppVar34 = tls->key_schedule;
          local_578 = ppVar15->off;
          uVar25 = ptls_buffer_reserve(ppVar15,1);
          if (uVar25 == 0) {
            ppVar15->base[ppVar15->off] = '\x02';
            ppVar15->off = ppVar15->off + 1;
            uVar25 = 0;
          }
          bVar67 = true;
          if (uVar25 == 0) {
            uVar25 = ptls_buffer_reserve(ppVar15,3);
            if (uVar25 == 0) {
              puVar41 = ppVar15->base;
              sVar63 = ppVar15->off;
              puVar41[sVar63 + 2] = '\0';
              puVar41 = puVar41 + sVar63;
              puVar41[0] = '\0';
              puVar41[1] = '\0';
              ppVar15->off = ppVar15->off + 3;
              uVar25 = 0;
            }
            bVar67 = true;
            if (uVar25 == 0) {
              sVar63 = ppVar15->off;
              ppVar16 = emitter->buf;
              uVar25 = ptls_buffer_reserve(ppVar16,2);
              if (uVar25 == 0) {
                puVar41 = ppVar16->base;
                sVar44 = ppVar16->off;
                (puVar41 + sVar44)[0] = '\x03';
                (puVar41 + sVar44)[1] = '\x03';
                ppVar16->off = ppVar16->off + 2;
                uVar25 = 0;
              }
              bVar67 = uVar25 != 0;
              if ((uVar25 == 0) &&
                 (uVar25 = ptls_buffer_reserve(emitter->buf,0x20), bVar67 = true, uVar25 == 0)) {
                puVar41 = emitter->buf->base;
                sVar44 = emitter->buf->off;
                puVar3 = puVar41 + sVar44 + 0x10;
                puVar3[0] = 0xc2;
                puVar3[1] = 0xa2;
                puVar3[2] = '\x11';
                puVar3[3] = '\x16';
                puVar3[4] = 'z';
                puVar3[5] = 0xbb;
                puVar3[6] = 0x8c;
                puVar3[7] = '^';
                puVar3[8] = '\a';
                puVar3[9] = 0x9e;
                puVar3[10] = '\t';
                puVar3[0xb] = 0xe2;
                puVar3[0xc] = 200;
                puVar3[0xd] = 0xa8;
                puVar3[0xe] = '3';
                puVar3[0xf] = 0x9c;
                puVar41 = puVar41 + sVar44;
                puVar41[0] = 0xcf;
                puVar41[1] = '!';
                puVar41[2] = 0xad;
                puVar41[3] = 't';
                puVar41[4] = 0xe5;
                puVar41[5] = 0x9a;
                puVar41[6] = 'a';
                puVar41[7] = '\x11';
                puVar41[8] = 0xbe;
                puVar41[9] = '\x1d';
                puVar41[10] = 0x8c;
                puVar41[0xb] = '\x02';
                puVar41[0xc] = '\x1e';
                puVar41[0xd] = 'e';
                puVar41[0xe] = 0xb8;
                puVar41[0xf] = 0x91;
                ppVar16 = emitter->buf;
                ppVar16->off = ppVar16->off + 0x20;
                uVar25 = ptls_buffer_reserve(ppVar16,1);
                if (uVar25 == 0) {
                  ppVar16->base[ppVar16->off] = '\0';
                  ppVar16->off = ppVar16->off + 1;
                  uVar25 = 0;
                }
                bVar67 = true;
                if (uVar25 == 0) {
                  sVar44 = emitter->buf->off;
                  uVar28 = ptls_buffer__do_pushv
                                     (emitter->buf,local_518.legacy_session_id.base,
                                      local_518.legacy_session_id.len);
                  uVar25 = 0;
                  if (uVar28 == 0) {
                    emitter->buf->base[sVar44 - 1] = (char)(int)emitter->buf->off - (char)sVar44;
                    bVar68 = true;
                    bVar67 = false;
                  }
                  else {
                    bVar68 = false;
                    uVar25 = uVar28;
                  }
                }
                else {
                  bVar68 = false;
                }
                if (bVar68) {
                  uVar46 = tls->cipher_suite->id;
                  ppVar16 = emitter->buf;
                  uVar25 = ptls_buffer_reserve(ppVar16,2);
                  if (uVar25 == 0) {
                    *(ushort *)(ppVar16->base + ppVar16->off) = uVar46 << 8 | uVar46 >> 8;
                    ppVar16->off = ppVar16->off + 2;
                    uVar25 = 0;
                  }
                  bVar67 = uVar25 != 0;
                  if (uVar25 == 0) {
                    ppVar16 = emitter->buf;
                    uVar25 = ptls_buffer_reserve(ppVar16,1);
                    if (uVar25 == 0) {
                      ppVar16->base[ppVar16->off] = '\0';
                      ppVar16->off = ppVar16->off + 1;
                      uVar25 = 0;
                    }
                    bVar67 = true;
                    if (uVar25 == 0) {
                      ppVar16 = emitter->buf;
                      uVar25 = ptls_buffer_reserve(ppVar16,2);
                      if (uVar25 == 0) {
                        puVar41 = ppVar16->base;
                        sVar44 = ppVar16->off;
                        (puVar41 + sVar44)[0] = '\0';
                        (puVar41 + sVar44)[1] = '\0';
                        ppVar16->off = ppVar16->off + 2;
                        uVar25 = 0;
                      }
                      bVar67 = true;
                      if (uVar25 == 0) {
                        ppVar16 = emitter->buf;
                        local_688 = (ptls_key_exchange_algorithm_t *)ppVar16->off;
                        uVar25 = ptls_buffer_reserve(ppVar16,2);
                        if (uVar25 == 0) {
                          puVar41 = ppVar16->base;
                          sVar44 = ppVar16->off;
                          (puVar41 + sVar44)[0] = '\0';
                          (puVar41 + sVar44)[1] = '+';
                          ppVar16->off = ppVar16->off + 2;
                          uVar25 = 0;
                        }
                        bVar67 = uVar25 != 0;
                        if (uVar25 == 0) {
                          ppVar16 = emitter->buf;
                          uVar25 = ptls_buffer_reserve(ppVar16,2);
                          uVar5 = local_518.selected_version;
                          if (uVar25 == 0) {
                            puVar41 = ppVar16->base;
                            sVar44 = ppVar16->off;
                            (puVar41 + sVar44)[0] = '\0';
                            (puVar41 + sVar44)[1] = '\0';
                            ppVar16->off = ppVar16->off + 2;
                            uVar25 = 0;
                          }
                          bVar67 = true;
                          if (uVar25 == 0) {
                            ppVar16 = emitter->buf;
                            sVar44 = ppVar16->off;
                            uVar25 = ptls_buffer_reserve(ppVar16,2);
                            if (uVar25 == 0) {
                              *(uint16_t *)(ppVar16->base + ppVar16->off) = uVar5 << 8 | uVar5 >> 8;
                              ppVar16->off = ppVar16->off + 2;
                              uVar25 = 0;
                            }
                            bVar67 = uVar25 != 0;
                            if (uVar25 == 0) {
                              uVar38 = emitter->buf->off - sVar44;
                              lVar37 = 8;
                              do {
                                emitter->buf->base[sVar44 - 2] =
                                     (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                lVar37 = lVar37 + -8;
                                sVar44 = sVar44 + 1;
                              } while (lVar37 != -8);
                              bVar67 = false;
                            }
                          }
                          if (!bVar67) {
                            if ((local_518.cookie._64_1_ & 1) == 0) {
LAB_0011b154:
                              ppVar16 = emitter->buf;
                              uVar25 = ptls_buffer_reserve(ppVar16,2);
                              if (uVar25 == 0) {
                                puVar41 = ppVar16->base;
                                sVar44 = ppVar16->off;
                                (puVar41 + sVar44)[0] = '\0';
                                (puVar41 + sVar44)[1] = ',';
                                ppVar16->off = ppVar16->off + 2;
                                uVar25 = 0;
                              }
                              bVar67 = uVar25 != 0;
                              if (!bVar67) {
                                ppVar16 = emitter->buf;
                                uVar25 = ptls_buffer_reserve(ppVar16,2);
                                if (uVar25 == 0) {
                                  puVar41 = ppVar16->base;
                                  sVar44 = ppVar16->off;
                                  (puVar41 + sVar44)[0] = '\0';
                                  (puVar41 + sVar44)[1] = '\0';
                                  ppVar16->off = ppVar16->off + 2;
                                  uVar25 = 0;
                                }
                                bVar67 = true;
                                if (uVar25 == 0) {
                                  sVar44 = emitter->buf->off;
                                  uVar25 = ptls_buffer__do_pushv
                                                     (emitter->buf,local_518.cookie.all.base,
                                                      local_518.cookie.all.len);
                                  if (uVar25 == 0) {
                                    uVar38 = emitter->buf->off - sVar44;
                                    lVar37 = 8;
                                    do {
                                      emitter->buf->base[sVar44 - 2] =
                                           (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                      lVar37 = lVar37 + -8;
                                      sVar44 = sVar44 + 1;
                                      bVar67 = false;
                                      uVar25 = 0;
                                    } while (lVar37 != -8);
                                  }
                                }
                              }
                            }
                            else {
                              ppVar16 = emitter->buf;
                              uVar25 = ptls_buffer_reserve(ppVar16,2);
                              if (uVar25 == 0) {
                                puVar41 = ppVar16->base;
                                sVar44 = ppVar16->off;
                                (puVar41 + sVar44)[0] = '\0';
                                (puVar41 + sVar44)[1] = '3';
                                ppVar16->off = ppVar16->off + 2;
                                uVar25 = 0;
                              }
                              bVar67 = uVar25 != 0;
                              if (!bVar67) {
                                ppVar16 = emitter->buf;
                                uVar25 = ptls_buffer_reserve(ppVar16,2);
                                if (uVar25 == 0) {
                                  puVar41 = ppVar16->base;
                                  sVar44 = ppVar16->off;
                                  (puVar41 + sVar44)[0] = '\0';
                                  (puVar41 + sVar44)[1] = '\0';
                                  ppVar16->off = ppVar16->off + 2;
                                  uVar25 = 0;
                                }
                                bVar67 = true;
                                if (uVar25 == 0) {
                                  ppVar16 = emitter->buf;
                                  sVar44 = ppVar16->off;
                                  uVar46 = ppVar36->id;
                                  uVar25 = ptls_buffer_reserve(ppVar16,2);
                                  if (uVar25 == 0) {
                                    *(ushort *)(ppVar16->base + ppVar16->off) =
                                         uVar46 << 8 | uVar46 >> 8;
                                    ppVar16->off = ppVar16->off + 2;
                                    uVar25 = 0;
                                  }
                                  bVar67 = uVar25 != 0;
                                  if (uVar25 == 0) {
                                    uVar38 = emitter->buf->off - sVar44;
                                    lVar37 = 8;
                                    do {
                                      emitter->buf->base[sVar44 - 2] =
                                           (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                      lVar37 = lVar37 + -8;
                                      sVar44 = sVar44 + 1;
                                    } while (lVar37 != -8);
                                    bVar67 = false;
                                  }
                                }
                                if (!bVar67) goto LAB_0011b154;
                              }
                            }
                            if (!bVar67) {
                              uVar38 = emitter->buf->off - (long)local_688;
                              lVar37 = 8;
                              do {
                                emitter->buf->base[(long)local_688 - 2] =
                                     (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                lVar37 = lVar37 + -8;
                                local_688 = (ptls_key_exchange_algorithm_t *)((long)local_688 + 1);
                                bVar67 = false;
                              } while (lVar37 != -8);
                            }
                          }
                        }
                      }
                      if (!bVar67) {
                        uVar38 = ppVar15->off - sVar63;
                        lVar37 = 0x10;
                        do {
                          ppVar15->base[sVar63 - 3] = (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                          lVar37 = lVar37 + -8;
                          sVar63 = sVar63 + 1;
                          bVar67 = false;
                        } while (lVar37 != -8);
                      }
                    }
                  }
                }
              }
            }
            if (!bVar67) {
              if ((ppVar34 != (ptls_key_schedule_t *)0x0) && (ppVar34->num_hashes != 0)) {
                puVar41 = ppVar15->base + local_578;
                sVar63 = ppVar15->off - local_578;
                pppVar58 = &ppVar34->hashes[0].ctx;
                sVar44 = 0;
                do {
                  (*(*pppVar58)->update)(*pppVar58,puVar41,sVar63);
                  sVar44 = sVar44 + 1;
                  pppVar58 = pppVar58 + 2;
                } while (sVar44 != ppVar34->num_hashes);
              }
              bVar67 = false;
            }
          }
          if (!bVar67) {
            uVar25 = (*emitter->commit_message)(emitter);
            bVar67 = uVar25 != 0;
          }
        }
        else {
          bVar67 = true;
        }
        if (!bVar67) {
          emitter->buf->off = sVar45;
          bVar66 = true;
          bVar67 = false;
        }
      }
      if (bVar67) goto joined_r0x00119315;
    }
  }
  uVar25 = report_unknown_extensions(tls,properties,local_518.unknown_extensions);
  if ((uVar25 != 0) ||
     (((((ptls_key_exchange_algorithm_t *)local_518.psk.hash_end !=
         (ptls_key_exchange_algorithm_t *)0x0 && !bVar66 && ((local_518.psk.ke_modes & 3) != 0)) &&
       (tls->ctx->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0)) &&
      (((tls->ctx->field_0x70 & 8) == 0 &&
       (ch_trunc.len = (long)local_518.psk.hash_end - (long)puVar35, ch_trunc.base = puVar35,
       uVar25 = try_psk_handshake(tls,&local_570,&local_58c,&local_518,ch_trunc), uVar25 != 0))))))
  goto LAB_001176f2;
  puVar41 = local_518.psk.hash_end;
  sVar45 = local_570;
  if ((local_570 == 0xffffffffffffffff) || ((tls->ctx->field_0x70 & 8) != 0)) {
    ppVar34 = tls->key_schedule;
    if (ppVar34->num_hashes != 0) {
      pppVar58 = &ppVar34->hashes[0].ctx;
      sVar63 = 0;
      do {
        (*(*pppVar58)->update)(*pppVar58,puVar35,sVar59);
        sVar63 = sVar63 + 1;
        pppVar58 = pppVar58 + 2;
      } while (sVar63 != ppVar34->num_hashes);
    }
    if (!bVar66) {
      if (tls->key_schedule->generation != 0) {
        __assert_fail("tls->key_schedule->generation == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                      ,0xf0e,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
    }
    iVar23 = 0;
    if (properties != (ptls_handshake_properties_t *)0x0) {
      sVar29 = 0;
      iVar23 = 0;
      goto LAB_001193b0;
    }
  }
  else {
    ppVar34 = tls->key_schedule;
    if (ppVar34->num_hashes != 0) {
      sVar63 = (long)ppVar2 - (long)local_518.psk.hash_end;
      pppVar58 = &ppVar34->hashes[0].ctx;
      sVar59 = 0;
      do {
        (*(*pppVar58)->update)(*pppVar58,puVar41,sVar63);
        sVar59 = sVar59 + 1;
        pppVar58 = pppVar58 + 2;
      } while (sVar59 != ppVar34->num_hashes);
    }
    iVar23 = 1;
    if (((local_518.psk.ke_modes & 1) == 0) && (iVar23 = 2, (local_518.psk.ke_modes & 2) == 0)) {
      __assert_fail("(ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                    ,0xf19,
                    "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                   );
    }
    tls->field_0x160 = tls->field_0x160 | 2;
    if (properties != (ptls_handshake_properties_t *)0x0) {
      sVar29 = local_518.psk.identities.list[sVar45].binder.len;
      memcpy(properties,local_518.psk.identities.list[sVar45].binder.base,sVar29);
LAB_001193b0:
      *(size_t *)((long)&properties->field_0 + 0x40) = sVar29;
    }
  }
  if (((local_58c != 0) && (sVar45 == 0)) && (tls->ctx->max_early_data_size != 0)) {
    puVar35 = (uint8_t *)malloc(0x40);
    tls->pending_handshake_secret = puVar35;
    if (puVar35 == (uint8_t *)0x0) {
      uVar25 = 0x201;
      goto LAB_001176f2;
    }
    uVar25 = derive_exporter_secret(tls,1);
    if ((uVar25 != 0) || (uVar25 = setup_traffic_protection(tls,0,"c e traffic",1,0), uVar25 != 0))
    goto LAB_001176f2;
  }
  ppVar2 = local_568;
  if (iVar23 != 1) {
    if (local_568 == (st_ptls_key_exchange_algorithm_t *)0x0) {
      uVar25 = 0x28;
      if ((ptls_key_exchange_algorithm_t *)local_518.key_shares.base ==
          (ptls_key_exchange_algorithm_t *)0x0) {
        uVar25 = 0x6d;
      }
      goto LAB_001176f2;
    }
    pVar20.len = pStack_560.len;
    pVar20.base = pStack_560.base;
    uVar25 = (*local_568->exchange)(local_568,&local_528,&local_548,pVar20);
    if (uVar25 != 0) goto LAB_001176f2;
    tls->key_share = ppVar2;
  }
  uVar25 = (*emitter->begin_message)(emitter);
  if (uVar25 == 0) {
    ppVar15 = emitter->buf;
    ppVar34 = tls->key_schedule;
    sVar59 = ppVar15->off;
    uVar25 = ptls_buffer_reserve(ppVar15,1);
    if (uVar25 == 0) {
      ppVar15->base[ppVar15->off] = '\x02';
      ppVar15->off = ppVar15->off + 1;
      uVar25 = 0;
    }
    bVar67 = true;
    if (uVar25 == 0) {
      uVar25 = ptls_buffer_reserve(ppVar15,3);
      if (uVar25 == 0) {
        puVar35 = ppVar15->base;
        sVar45 = ppVar15->off;
        puVar35[sVar45 + 2] = '\0';
        puVar35 = puVar35 + sVar45;
        puVar35[0] = '\0';
        puVar35[1] = '\0';
        ppVar15->off = ppVar15->off + 3;
        uVar25 = 0;
      }
      bVar67 = true;
      if (uVar25 == 0) {
        local_668 = ppVar15->off;
        ppVar16 = emitter->buf;
        uVar25 = ptls_buffer_reserve(ppVar16,2);
        if (uVar25 == 0) {
          puVar35 = ppVar16->base;
          sVar45 = ppVar16->off;
          (puVar35 + sVar45)[0] = '\x03';
          (puVar35 + sVar45)[1] = '\x03';
          ppVar16->off = ppVar16->off + 2;
          uVar25 = 0;
        }
        bVar67 = uVar25 != 0;
        if ((uVar25 == 0) &&
           (uVar25 = ptls_buffer_reserve(emitter->buf,0x20), bVar67 = true, uVar25 == 0)) {
          (*tls->ctx->random_bytes)(emitter->buf->base + emitter->buf->off,0x20);
          ppVar16 = emitter->buf;
          ppVar16->off = ppVar16->off + 0x20;
          uVar25 = ptls_buffer_reserve(ppVar16,1);
          if (uVar25 == 0) {
            ppVar16->base[ppVar16->off] = '\0';
            ppVar16->off = ppVar16->off + 1;
            uVar25 = 0;
          }
          bVar67 = true;
          if (uVar25 == 0) {
            sVar45 = emitter->buf->off;
            uVar28 = ptls_buffer__do_pushv
                               (emitter->buf,local_518.legacy_session_id.base,
                                local_518.legacy_session_id.len);
            uVar25 = 0;
            if (uVar28 == 0) {
              emitter->buf->base[sVar45 - 1] = (char)(int)emitter->buf->off - (char)sVar45;
              bVar66 = true;
              bVar67 = false;
            }
            else {
              bVar66 = false;
              uVar25 = uVar28;
            }
          }
          else {
            bVar66 = false;
          }
          if (bVar66) {
            uVar46 = tls->cipher_suite->id;
            ppVar16 = emitter->buf;
            uVar25 = ptls_buffer_reserve(ppVar16,2);
            if (uVar25 == 0) {
              *(ushort *)(ppVar16->base + ppVar16->off) = uVar46 << 8 | uVar46 >> 8;
              ppVar16->off = ppVar16->off + 2;
              uVar25 = 0;
            }
            bVar67 = uVar25 != 0;
            if (uVar25 == 0) {
              ppVar16 = emitter->buf;
              uVar25 = ptls_buffer_reserve(ppVar16,1);
              if (uVar25 == 0) {
                ppVar16->base[ppVar16->off] = '\0';
                ppVar16->off = ppVar16->off + 1;
                uVar25 = 0;
              }
              bVar67 = true;
              if (uVar25 == 0) {
                ppVar16 = emitter->buf;
                uVar25 = ptls_buffer_reserve(ppVar16,2);
                if (uVar25 == 0) {
                  puVar35 = ppVar16->base;
                  sVar45 = ppVar16->off;
                  (puVar35 + sVar45)[0] = '\0';
                  (puVar35 + sVar45)[1] = '\0';
                  ppVar16->off = ppVar16->off + 2;
                  uVar25 = 0;
                }
                bVar67 = true;
                if (uVar25 == 0) {
                  ppVar16 = emitter->buf;
                  sVar45 = ppVar16->off;
                  uVar25 = ptls_buffer_reserve(ppVar16,2);
                  if (uVar25 == 0) {
                    puVar35 = ppVar16->base;
                    sVar63 = ppVar16->off;
                    (puVar35 + sVar63)[0] = '\0';
                    (puVar35 + sVar63)[1] = '+';
                    ppVar16->off = ppVar16->off + 2;
                    uVar25 = 0;
                  }
                  bVar67 = uVar25 != 0;
                  if (uVar25 == 0) {
                    ppVar16 = emitter->buf;
                    uVar25 = ptls_buffer_reserve(ppVar16,2);
                    uVar5 = local_518.selected_version;
                    if (uVar25 == 0) {
                      puVar35 = ppVar16->base;
                      sVar63 = ppVar16->off;
                      (puVar35 + sVar63)[0] = '\0';
                      (puVar35 + sVar63)[1] = '\0';
                      ppVar16->off = ppVar16->off + 2;
                      uVar25 = 0;
                    }
                    bVar67 = true;
                    if (uVar25 == 0) {
                      ppVar16 = emitter->buf;
                      sVar63 = ppVar16->off;
                      uVar25 = ptls_buffer_reserve(ppVar16,2);
                      if (uVar25 == 0) {
                        *(uint16_t *)(ppVar16->base + ppVar16->off) = uVar5 << 8 | uVar5 >> 8;
                        ppVar16->off = ppVar16->off + 2;
                        uVar25 = 0;
                      }
                      bVar67 = uVar25 != 0;
                      if (uVar25 == 0) {
                        uVar38 = emitter->buf->off - sVar63;
                        lVar37 = 8;
                        do {
                          emitter->buf->base[sVar63 - 2] =
                               (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                          lVar37 = lVar37 + -8;
                          sVar63 = sVar63 + 1;
                        } while (lVar37 != -8);
                        bVar67 = false;
                      }
                    }
                    if (!bVar67) {
                      ppVar16 = emitter->buf;
                      if (iVar23 == 1) {
LAB_0011ac09:
                        if (iVar23 == 0) {
LAB_0011ad0d:
                          bVar67 = false;
                        }
                        else {
                          uVar25 = ptls_buffer_reserve(ppVar16,2);
                          if (uVar25 == 0) {
                            puVar35 = ppVar16->base;
                            sVar63 = ppVar16->off;
                            (puVar35 + sVar63)[0] = '\0';
                            (puVar35 + sVar63)[1] = ')';
                            ppVar16->off = ppVar16->off + 2;
                            uVar25 = 0;
                          }
                          bVar67 = uVar25 != 0;
                          if (!bVar67) {
                            uVar25 = ptls_buffer_reserve(ppVar16,2);
                            sVar63 = local_570;
                            if (uVar25 == 0) {
                              puVar35 = ppVar16->base;
                              sVar44 = ppVar16->off;
                              (puVar35 + sVar44)[0] = '\0';
                              (puVar35 + sVar44)[1] = '\0';
                              ppVar16->off = ppVar16->off + 2;
                              uVar25 = 0;
                            }
                            bVar67 = true;
                            if (uVar25 == 0) {
                              sVar44 = ppVar16->off;
                              uVar25 = ptls_buffer_reserve(ppVar16,2);
                              if (uVar25 == 0) {
                                *(ushort *)(ppVar16->base + ppVar16->off) =
                                     (ushort)sVar63 << 8 | (ushort)sVar63 >> 8;
                                ppVar16->off = ppVar16->off + 2;
                                uVar25 = 0;
                              }
                              bVar67 = uVar25 != 0;
                              if (!bVar67) {
                                uVar38 = ppVar16->off - sVar44;
                                lVar37 = 8;
                                do {
                                  ppVar16->base[sVar44 - 2] =
                                       (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                  lVar37 = lVar37 + -8;
                                  sVar44 = sVar44 + 1;
                                } while (lVar37 != -8);
                                goto LAB_0011ad0d;
                              }
                            }
                          }
                        }
                      }
                      else {
                        uVar25 = ptls_buffer_reserve(ppVar16,2);
                        if (uVar25 == 0) {
                          puVar35 = ppVar16->base;
                          sVar63 = ppVar16->off;
                          (puVar35 + sVar63)[0] = '\0';
                          (puVar35 + sVar63)[1] = '3';
                          ppVar16->off = ppVar16->off + 2;
                          uVar25 = 0;
                        }
                        bVar67 = uVar25 != 0;
                        if (!bVar67) {
                          uVar25 = ptls_buffer_reserve(ppVar16,2);
                          if (uVar25 == 0) {
                            puVar35 = ppVar16->base;
                            sVar63 = ppVar16->off;
                            (puVar35 + sVar63)[0] = '\0';
                            (puVar35 + sVar63)[1] = '\0';
                            ppVar16->off = ppVar16->off + 2;
                            uVar25 = 0;
                          }
                          bVar67 = true;
                          if (uVar25 == 0) {
                            sVar63 = ppVar16->off;
                            uVar46 = local_568->id;
                            uVar25 = ptls_buffer_reserve(ppVar16,2);
                            if (uVar25 == 0) {
                              *(ushort *)(ppVar16->base + ppVar16->off) = uVar46 << 8 | uVar46 >> 8;
                              ppVar16->off = ppVar16->off + 2;
                              uVar25 = 0;
                            }
                            bVar67 = uVar25 != 0;
                            if (uVar25 == 0) {
                              uVar25 = ptls_buffer_reserve(ppVar16,2);
                              if (uVar25 == 0) {
                                puVar35 = ppVar16->base;
                                sVar44 = ppVar16->off;
                                (puVar35 + sVar44)[0] = '\0';
                                (puVar35 + sVar44)[1] = '\0';
                                ppVar16->off = ppVar16->off + 2;
                                uVar25 = 0;
                              }
                              bVar67 = true;
                              if (uVar25 == 0) {
                                local_660 = ppVar16->off;
                                uVar25 = ptls_buffer__do_pushv(ppVar16,local_528.base,local_528.len)
                                ;
                                if (uVar25 != 0) goto LAB_0011bb6d;
                                uVar38 = ppVar16->off - local_660;
                                lVar37 = 8;
                                do {
                                  ppVar16->base[local_660 - 2] =
                                       (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                  lVar37 = lVar37 + -8;
                                  local_660 = local_660 + 1;
                                } while (lVar37 != -8);
                                bVar67 = false;
                                bVar66 = true;
                                uVar25 = 0;
                              }
                              else {
LAB_0011bb6d:
                                bVar66 = false;
                              }
                              if (bVar66) {
                                uVar38 = ppVar16->off - sVar63;
                                lVar37 = 8;
                                do {
                                  ppVar16->base[sVar63 - 2] =
                                       (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                                  lVar37 = lVar37 + -8;
                                  sVar63 = sVar63 + 1;
                                } while (lVar37 != -8);
                                bVar67 = false;
                              }
                            }
                          }
                          if (!bVar67) goto LAB_0011ac09;
                        }
                      }
                      if (!bVar67) {
                        uVar38 = emitter->buf->off - sVar45;
                        lVar37 = 8;
                        do {
                          emitter->buf->base[sVar45 - 2] =
                               (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                          lVar37 = lVar37 + -8;
                          sVar45 = sVar45 + 1;
                          bVar67 = false;
                        } while (lVar37 != -8);
                      }
                    }
                  }
                }
                if (!bVar67) {
                  uVar38 = ppVar15->off - local_668;
                  lVar37 = 0x10;
                  do {
                    ppVar15->base[local_668 - 3] = (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                    lVar37 = lVar37 + -8;
                    local_668 = local_668 + 1;
                    bVar67 = false;
                  } while (lVar37 != -8);
                }
              }
            }
          }
        }
      }
      if ((!bVar67) && (bVar67 = false, ppVar34 != (ptls_key_schedule_t *)0x0)) {
        if (ppVar34->num_hashes != 0) {
          puVar35 = ppVar15->base;
          sVar45 = ppVar15->off;
          pppVar58 = &ppVar34->hashes[0].ctx;
          sVar63 = 0;
          do {
            (*(*pppVar58)->update)(*pppVar58,puVar35 + sVar59,sVar45 - sVar59);
            sVar63 = sVar63 + 1;
            pppVar58 = pppVar58 + 2;
          } while (sVar63 != ppVar34->num_hashes);
        }
        bVar67 = false;
      }
    }
    if (!bVar67) {
      uVar25 = (*emitter->commit_message)(emitter);
      bVar67 = uVar25 != 0;
    }
  }
  else {
    bVar67 = true;
  }
  if (bVar67) goto LAB_001176f2;
  if (bVar67) {
    return uVar25;
  }
  uVar25 = push_change_cipher_spec(tls,emitter);
  if (uVar25 != 0) goto LAB_001176f2;
  if (tls->key_schedule->generation != 1) {
    __assert_fail("tls->key_schedule->generation == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                  ,0xf4e,
                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  ikm.len = local_548.len;
  ikm.base = local_548.base;
  key_schedule_extract(tls->key_schedule,ikm);
  uVar25 = setup_traffic_protection(tls,1,"s hs traffic",2,0);
  if (uVar25 != 0) goto LAB_001176f2;
  if (tls->pending_handshake_secret == (uint8_t *)0x0) {
    uVar25 = setup_traffic_protection(tls,0,"c hs traffic",2,0);
    if (uVar25 != 0) goto LAB_001176f2;
    if (local_518.psk.early_data_indication != 0) {
      (tls->field_18).server.early_data_skipped_bytes = 0;
    }
  }
  else {
    uVar25 = derive_secret(tls->key_schedule,tls->pending_handshake_secret,"c hs traffic");
    if ((uVar25 != 0) ||
       ((psVar13 = tls->ctx->update_traffic_key, psVar13 != (st_ptls_update_traffic_key_t *)0x0 &&
        (uVar25 = (*psVar13->cb)(psVar13,tls,0,2,tls->pending_handshake_secret), uVar25 != 0))))
    goto LAB_001176f2;
  }
  uVar25 = (*emitter->begin_message)(emitter);
  if (uVar25 == 0) {
    ppVar15 = emitter->buf;
    ppVar34 = tls->key_schedule;
    sVar59 = ppVar15->off;
    uVar25 = ptls_buffer_reserve(ppVar15,1);
    if (uVar25 == 0) {
      ppVar15->base[ppVar15->off] = '\b';
      ppVar15->off = ppVar15->off + 1;
      uVar25 = 0;
    }
    bVar67 = true;
    if (uVar25 == 0) {
      uVar25 = ptls_buffer_reserve(ppVar15,3);
      if (uVar25 == 0) {
        puVar35 = ppVar15->base;
        sVar45 = ppVar15->off;
        puVar35[sVar45 + 2] = '\0';
        puVar35 = puVar35 + sVar45;
        puVar35[0] = '\0';
        puVar35[1] = '\0';
        ppVar15->off = ppVar15->off + 3;
        uVar25 = 0;
      }
      bVar67 = true;
      if (uVar25 == 0) {
        sVar45 = ppVar15->off;
        ppVar16 = emitter->buf;
        uVar25 = ptls_buffer_reserve(ppVar16,2);
        if (uVar25 == 0) {
          puVar35 = ppVar16->base;
          sVar63 = ppVar16->off;
          (puVar35 + sVar63)[0] = '\0';
          (puVar35 + sVar63)[1] = '\0';
          ppVar16->off = ppVar16->off + 2;
          uVar25 = 0;
        }
        bVar67 = true;
        if (uVar25 == 0) {
          local_668 = ppVar16->off;
          if (tls->esni == (ptls_esni_secret_t *)0x0) {
            if (tls->server_name == (char *)0x0) {
LAB_0011ae81:
              if (tls->negotiated_protocol == (char *)0x0) {
LAB_0011bdb3:
                if (tls->pending_handshake_secret == (uint8_t *)0x0) {
LAB_0011c27a:
                  uVar25 = push_additional_extensions(properties,ppVar16);
                  bVar67 = true;
                  if (uVar25 == 0) {
                    uVar38 = ppVar16->off - local_668;
                    lVar37 = 8;
                    do {
                      ppVar16->base[local_668 - 2] = (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                      lVar37 = lVar37 + -8;
                      local_668 = local_668 + 1;
                      bVar67 = false;
                      uVar25 = 0;
                    } while (lVar37 != -8);
                  }
                }
                else {
                  uVar25 = ptls_buffer_reserve(ppVar16,2);
                  if (uVar25 == 0) {
                    puVar35 = ppVar16->base;
                    sVar63 = ppVar16->off;
                    (puVar35 + sVar63)[0] = '\0';
                    (puVar35 + sVar63)[1] = '*';
                    ppVar16->off = ppVar16->off + 2;
                    uVar25 = 0;
                  }
                  bVar67 = uVar25 != 0;
                  if (!bVar67) {
                    uVar28 = ptls_buffer_reserve(ppVar16,2);
                    if (uVar28 == 0) {
                      puVar35 = ppVar16->base;
                      sVar63 = ppVar16->off;
                      (puVar35 + sVar63)[0] = '\0';
                      (puVar35 + sVar63)[1] = '\0';
                      ppVar16->off = ppVar16->off + 2;
                      uVar28 = 0;
                    }
                    bVar67 = true;
                    uVar25 = uVar28;
                    if (uVar28 == 0) {
                      sVar63 = ppVar16->off;
                      lVar37 = -2;
                      do {
                        ppVar16->base[lVar37 + sVar63] = '\0';
                        lVar37 = lVar37 + 1;
                      } while (lVar37 != 0);
                      bVar67 = false;
                      uVar25 = 0;
                    }
                    if (uVar28 == 0) goto LAB_0011c27a;
                  }
                }
              }
              else {
                uVar25 = ptls_buffer_reserve(ppVar16,2);
                if (uVar25 == 0) {
                  puVar35 = ppVar16->base;
                  sVar63 = ppVar16->off;
                  (puVar35 + sVar63)[0] = '\0';
                  (puVar35 + sVar63)[1] = '\x10';
                  ppVar16->off = ppVar16->off + 2;
                  uVar25 = 0;
                }
                bVar67 = uVar25 != 0;
                if (!bVar67) {
                  uVar25 = ptls_buffer_reserve(ppVar16,2);
                  if (uVar25 == 0) {
                    puVar35 = ppVar16->base;
                    sVar63 = ppVar16->off;
                    (puVar35 + sVar63)[0] = '\0';
                    (puVar35 + sVar63)[1] = '\0';
                    ppVar16->off = ppVar16->off + 2;
                    uVar25 = 0;
                  }
                  bVar67 = true;
                  if (uVar25 == 0) {
                    sVar63 = ppVar16->off;
                    uVar25 = ptls_buffer_reserve(ppVar16,2);
                    if (uVar25 == 0) {
                      puVar35 = ppVar16->base;
                      sVar44 = ppVar16->off;
                      (puVar35 + sVar44)[0] = '\0';
                      (puVar35 + sVar44)[1] = '\0';
                      ppVar16->off = ppVar16->off + 2;
                      uVar25 = 0;
                    }
                    bVar67 = true;
                    if (uVar25 == 0) {
                      local_660 = ppVar16->off;
                      uVar25 = ptls_buffer_reserve(ppVar16,1);
                      if (uVar25 == 0) {
                        ppVar16->base[ppVar16->off] = '\0';
                        ppVar16->off = ppVar16->off + 1;
                        uVar25 = 0;
                      }
                      bVar67 = true;
                      if (uVar25 == 0) {
                        sVar44 = ppVar16->off;
                        pcVar7 = tls->negotiated_protocol;
                        sVar29 = strlen(pcVar7);
                        uVar28 = ptls_buffer__do_pushv(ppVar16,pcVar7,sVar29);
                        uVar25 = 0;
                        if (uVar28 == 0) {
                          ppVar16->base[sVar44 - 1] = (char)(int)ppVar16->off - (char)sVar44;
                          bVar66 = true;
                          bVar67 = false;
                        }
                        else {
                          bVar66 = false;
                          uVar25 = uVar28;
                        }
                      }
                      else {
                        bVar66 = false;
                      }
                      if (bVar66) {
                        uVar38 = ppVar16->off - local_660;
                        lVar37 = 8;
                        do {
                          ppVar16->base[local_660 - 2] = (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                          lVar37 = lVar37 + -8;
                          local_660 = local_660 + 1;
                        } while (lVar37 != -8);
                        bVar67 = false;
                      }
                    }
                    if (!bVar67) {
                      uVar38 = ppVar16->off - sVar63;
                      lVar37 = 8;
                      do {
                        ppVar16->base[sVar63 - 2] = (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                        lVar37 = lVar37 + -8;
                        sVar63 = sVar63 + 1;
                      } while (lVar37 != -8);
                      bVar67 = false;
                    }
                  }
                  if (!bVar67) goto LAB_0011bdb3;
                }
              }
            }
            else {
              uVar25 = ptls_buffer_reserve(ppVar16,2);
              if (uVar25 == 0) {
                puVar35 = ppVar16->base;
                sVar63 = ppVar16->off;
                (puVar35 + sVar63)[0] = '\0';
                (puVar35 + sVar63)[1] = '\0';
                ppVar16->off = ppVar16->off + 2;
                uVar25 = 0;
              }
              bVar67 = uVar25 != 0;
              if (!bVar67) {
                uVar28 = ptls_buffer_reserve(ppVar16,2);
                if (uVar28 == 0) {
                  puVar35 = ppVar16->base;
                  sVar63 = ppVar16->off;
                  (puVar35 + sVar63)[0] = '\0';
                  (puVar35 + sVar63)[1] = '\0';
                  ppVar16->off = ppVar16->off + 2;
                  uVar28 = 0;
                }
                bVar67 = true;
                uVar25 = uVar28;
                if (uVar28 == 0) {
                  sVar63 = ppVar16->off;
                  lVar37 = -2;
                  do {
                    ppVar16->base[lVar37 + sVar63] = '\0';
                    lVar37 = lVar37 + 1;
                  } while (lVar37 != 0);
                  bVar67 = false;
                  uVar25 = 0;
                }
                if (uVar28 == 0) goto LAB_0011ae81;
              }
            }
          }
          else {
            uVar25 = ptls_buffer_reserve(ppVar16,2);
            if (uVar25 == 0) {
              puVar35 = ppVar16->base;
              sVar63 = ppVar16->off;
              (puVar35 + sVar63)[0] = 0xff;
              (puVar35 + sVar63)[1] = 0xce;
              ppVar16->off = ppVar16->off + 2;
              uVar25 = 0;
            }
            bVar67 = uVar25 != 0;
            if (!bVar67) {
              uVar25 = ptls_buffer_reserve(ppVar16,2);
              if (uVar25 == 0) {
                puVar35 = ppVar16->base;
                sVar63 = ppVar16->off;
                (puVar35 + sVar63)[0] = '\0';
                (puVar35 + sVar63)[1] = '\0';
                ppVar16->off = ppVar16->off + 2;
                uVar25 = 0;
              }
              bVar67 = true;
              if (uVar25 == 0) {
                sVar63 = ppVar16->off;
                uVar25 = ptls_buffer_reserve(ppVar16,1);
                if (uVar25 == 0) {
                  ppVar16->base[ppVar16->off] = '\0';
                  ppVar16->off = ppVar16->off + 1;
                  uVar25 = 0;
                }
                if (uVar25 == 0) {
                  ppVar30 = tls->esni;
                  uVar25 = ptls_buffer_reserve(ppVar16,0x10);
                  if (uVar25 == 0) {
                    puVar35 = ppVar16->base;
                    sVar44 = ppVar16->off;
                    uVar17 = *(undefined8 *)(ppVar30->nonce + 8);
                    *(undefined8 *)(puVar35 + sVar44) = *(undefined8 *)ppVar30->nonce;
                    *(undefined8 *)(puVar35 + sVar44 + 8) = uVar17;
                    ppVar16->off = ppVar16->off + 0x10;
                    uVar25 = 0;
                  }
                  bVar66 = uVar25 == 0;
                  bVar67 = !bVar66;
                }
                else {
                  bVar67 = true;
                  bVar66 = false;
                }
                if (bVar66) {
                  uVar38 = ppVar16->off - sVar63;
                  lVar37 = 8;
                  do {
                    ppVar16->base[sVar63 - 2] = (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                    lVar37 = lVar37 + -8;
                    sVar63 = sVar63 + 1;
                  } while (lVar37 != -8);
                  bVar67 = false;
                }
              }
              if (!bVar67) {
                free_esni_secret(&tls->esni,1);
                goto LAB_0011ae81;
              }
            }
          }
        }
        if (!bVar67) {
          uVar38 = ppVar15->off - sVar45;
          lVar37 = 0x10;
          do {
            ppVar15->base[sVar45 - 3] = (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
            lVar37 = lVar37 + -8;
            sVar45 = sVar45 + 1;
          } while (lVar37 != -8);
          bVar67 = false;
        }
      }
      if (((!bVar67) && (bVar67 = false, ppVar34 != (ptls_key_schedule_t *)0x0)) &&
         (ppVar34->num_hashes != 0)) {
        puVar35 = ppVar15->base;
        sVar45 = ppVar15->off;
        pppVar58 = &ppVar34->hashes[0].ctx;
        bVar67 = false;
        sVar63 = 0;
        do {
          (*(*pppVar58)->update)(*pppVar58,puVar35 + sVar59,sVar45 - sVar59);
          sVar63 = sVar63 + 1;
          pppVar58 = pppVar58 + 2;
        } while (sVar63 != ppVar34->num_hashes);
      }
    }
    if (!bVar67) {
      uVar25 = (*emitter->commit_message)(emitter);
      bVar67 = uVar25 != 0;
    }
  }
  else {
    bVar67 = true;
  }
  if (bVar67) goto LAB_001176f2;
  if (bVar67) {
    return uVar25;
  }
  if (iVar23 == 0) {
    if ((tls->ctx->field_0x70 & 8) != 0) {
      uVar25 = (*emitter->begin_message)(emitter);
      if (uVar25 == 0) {
        ppVar15 = emitter->buf;
        ppVar34 = tls->key_schedule;
        sVar59 = ppVar15->off;
        uVar25 = ptls_buffer_reserve(ppVar15,1);
        if (uVar25 == 0) {
          ppVar15->base[ppVar15->off] = '\r';
          ppVar15->off = ppVar15->off + 1;
          uVar25 = 0;
        }
        bVar67 = true;
        if (uVar25 == 0) {
          uVar25 = ptls_buffer_reserve(ppVar15,3);
          if (uVar25 == 0) {
            puVar35 = ppVar15->base;
            sVar45 = ppVar15->off;
            puVar35[sVar45 + 2] = '\0';
            puVar35 = puVar35 + sVar45;
            puVar35[0] = '\0';
            puVar35[1] = '\0';
            ppVar15->off = ppVar15->off + 3;
            uVar25 = 0;
          }
          bVar67 = true;
          if (uVar25 == 0) {
            sVar45 = ppVar15->off;
            ppVar16 = emitter->buf;
            uVar25 = ptls_buffer_reserve(ppVar16,1);
            if (uVar25 == 0) {
              ppVar16->base[ppVar16->off] = '\0';
              ppVar16->off = ppVar16->off + 1;
              uVar25 = 0;
            }
            bVar67 = true;
            if (uVar25 == 0) {
              uVar25 = ptls_buffer_reserve(ppVar16,2);
              if (uVar25 == 0) {
                puVar35 = ppVar16->base;
                sVar63 = ppVar16->off;
                (puVar35 + sVar63)[0] = '\0';
                (puVar35 + sVar63)[1] = '\0';
                ppVar16->off = ppVar16->off + 2;
                uVar25 = 0;
              }
              if (uVar25 == 0) {
                sVar63 = ppVar16->off;
                uVar25 = ptls_buffer_reserve(ppVar16,2);
                if (uVar25 == 0) {
                  puVar35 = ppVar16->base;
                  sVar44 = ppVar16->off;
                  (puVar35 + sVar44)[0] = '\0';
                  (puVar35 + sVar44)[1] = '\r';
                  ppVar16->off = ppVar16->off + 2;
                  uVar25 = 0;
                }
                bVar67 = uVar25 != 0;
                if (uVar25 == 0) {
                  uVar25 = ptls_buffer_reserve(ppVar16,2);
                  if (uVar25 == 0) {
                    puVar35 = ppVar16->base;
                    sVar44 = ppVar16->off;
                    (puVar35 + sVar44)[0] = '\0';
                    (puVar35 + sVar44)[1] = '\0';
                    ppVar16->off = ppVar16->off + 2;
                    uVar25 = 0;
                  }
                  bVar67 = true;
                  if (uVar25 == 0) {
                    sVar44 = ppVar16->off;
                    uVar25 = push_signature_algorithms(ppVar16);
                    if (uVar25 != 0) goto LAB_0011c33e;
                    uVar38 = ppVar16->off - sVar44;
                    lVar37 = 8;
                    do {
                      ppVar16->base[sVar44 - 2] = (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                      lVar37 = lVar37 + -8;
                      sVar44 = sVar44 + 1;
                    } while (lVar37 != -8);
                    bVar67 = false;
                    bVar66 = true;
                    uVar25 = 0;
                  }
                  else {
LAB_0011c33e:
                    bVar66 = false;
                  }
                  if (bVar66) {
                    uVar38 = ppVar16->off - sVar63;
                    lVar37 = 8;
                    do {
                      ppVar16->base[sVar63 - 2] = (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                      lVar37 = lVar37 + -8;
                      sVar63 = sVar63 + 1;
                      bVar67 = false;
                    } while (lVar37 != -8);
                  }
                }
              }
            }
            if (!bVar67) {
              uVar38 = ppVar15->off - sVar45;
              lVar37 = 0x10;
              do {
                ppVar15->base[sVar45 - 3] = (uint8_t)(uVar38 >> ((byte)lVar37 & 0x3f));
                lVar37 = lVar37 + -8;
                sVar45 = sVar45 + 1;
              } while (lVar37 != -8);
              bVar67 = false;
            }
          }
          if (((!bVar67) && (bVar67 = false, ppVar34 != (ptls_key_schedule_t *)0x0)) &&
             (ppVar34->num_hashes != 0)) {
            puVar35 = ppVar15->base;
            sVar45 = ppVar15->off;
            pppVar58 = &ppVar34->hashes[0].ctx;
            bVar67 = false;
            sVar63 = 0;
            do {
              (*(*pppVar58)->update)(*pppVar58,puVar35 + sVar59,sVar45 - sVar59);
              sVar63 = sVar63 + 1;
              pppVar58 = pppVar58 + 2;
            } while (sVar63 != ppVar34->num_hashes);
          }
        }
        if (!bVar67) {
          uVar25 = (*emitter->commit_message)(emitter);
          bVar67 = uVar25 != 0;
        }
      }
      else {
        bVar67 = true;
      }
      if (bVar67) goto LAB_001176f2;
      if (bVar67) {
        return uVar25;
      }
      if (uVar25 != 0) goto LAB_001176f2;
    }
    uVar25 = send_certificate_and_certificate_verify
                       (tls,emitter,&local_518.signature_algorithms,(ptls_iovec_t)ZEXT816(0),
                        "TLS 1.3, server CertificateVerify",(byte)local_518._1248_1_ & 1,
                        local_518.cert_compression_algos.list,local_518.cert_compression_algos.count
                       );
    if (uVar25 != 0) goto LAB_001176f2;
  }
  uVar25 = send_finished(tls,emitter);
  if (uVar25 == 0) {
    if (tls->key_schedule->generation != 2) {
      __assert_fail("tls->key_schedule->generation == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                    ,0xfa4,
                    "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                   );
    }
    uVar25 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
    if (((uVar25 == 0) && (uVar25 = setup_traffic_protection(tls,1,"s ap traffic",3,0), uVar25 == 0)
        ) && ((uVar25 = derive_secret(tls->key_schedule,&tls->field_18,"c ap traffic"), uVar25 == 0
              && (uVar25 = derive_exporter_secret(tls,0), uVar25 == 0)))) {
      bVar64 = tls->ctx->field_0x70;
      if (tls->pending_handshake_secret == (uint8_t *)0x0) {
        eVar27 = (uint)((bVar64 & 8) == 0) * 3 + PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
      }
      else {
        eVar27 = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
        if ((bVar64 & 0x10) != 0) {
          uVar25 = commission_handshake_secret(tls);
          if (uVar25 != 0) goto LAB_001176f2;
          eVar27 = PTLS_STATE_SERVER_EXPECT_FINISHED;
        }
      }
      tls->state = eVar27;
      if ((((local_518.psk.ke_modes == 0) || (tls->ctx->ticket_lifetime == 0)) ||
          (uVar25 = send_session_ticket(tls,emitter), uVar25 == 0)) &&
         (uVar25 = 0x202, (tls->ctx->field_0x70 & 8) == 0)) {
        uVar25 = 0;
      }
    }
  }
LAB_001176f2:
  free(local_528.base);
  if (local_548.base != (uint8_t *)0x0) {
    (*ptls_clear_memory)(local_548.base,local_548.len);
    free(local_548.base);
  }
  return uVar25;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions)                                                                            \
    ptls_push_message(emitter, (sched), PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                        \
        ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                             \
        if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                                \
            goto Exit;                                                                                                             \
        do {                                                                                                                       \
            fill_rand                                                                                                              \
        } while (0);                                                                                                               \
        emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                               \
        ptls_buffer_push_block(emitter->buf, 1,                                                                                    \
                               { ptls_buffer_pushv(emitter->buf, ch.legacy_session_id.base, ch.legacy_session_id.len); });         \
        ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                                   \
        ptls_buffer_push(emitter->buf, 0);                                                                                         \
        ptls_buffer_push_block(emitter->buf, 2, {                                                                                  \
            buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                            \
                                  { ptls_buffer_push16(emitter->buf, ch.selected_version); });                                     \
            do {                                                                                                                   \
                extensions                                                                                                         \
            } while (0);                                                                                                           \
        });                                                                                                                        \
    }